

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  bool bVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  bool bVar66;
  undefined1 auVar67 [12];
  undefined1 auVar68 [32];
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  uint uVar86;
  ulong uVar87;
  uint uVar88;
  ulong uVar89;
  byte unaff_BL;
  long lVar90;
  uint uVar91;
  float fVar95;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ulong uVar92;
  undefined4 uVar93;
  float fVar94;
  float fVar96;
  undefined8 uVar97;
  undefined1 auVar98 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar117 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar125;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar146 [32];
  float fVar158;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar135 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar145 [16];
  undefined1 auVar155 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar168 [32];
  float fVar178;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar164 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar204;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar218;
  float fVar221;
  undefined1 auVar210 [28];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar209 [16];
  undefined1 auVar214 [32];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar220;
  undefined1 auVar215 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar240;
  undefined1 auVar241 [28];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar242 [32];
  float fVar251;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  float fVar259;
  undefined1 auVar260 [32];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 in_ZMM10 [64];
  undefined1 auVar261 [64];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar266 [64];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  float fVar282;
  float fVar283;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [64];
  undefined1 auVar284 [16];
  float fVar289;
  float fVar290;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar291;
  undefined1 auVar288 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_bc1;
  undefined1 local_bc0 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 *local_a00;
  ulong local_9f8;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  Primitive *local_7f8;
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  uint local_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  uint local_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint uStack_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  undefined1 local_5c0 [32];
  ulong local_5a0;
  undefined1 auStack_598 [24];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar265 [16];
  
  PVar7 = prim[1];
  uVar87 = (ulong)(byte)PVar7;
  lVar90 = uVar87 * 0x19;
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar206 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar206 = vinsertps_avx(auVar206,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar94 = *(float *)(prim + lVar90 + 0x12);
  auVar103 = vsubps_avx(auVar103,*(undefined1 (*) [16])(prim + lVar90 + 6));
  auVar98._0_4_ = fVar94 * auVar103._0_4_;
  auVar98._4_4_ = fVar94 * auVar103._4_4_;
  auVar98._8_4_ = fVar94 * auVar103._8_4_;
  auVar98._12_4_ = fVar94 * auVar103._12_4_;
  auVar234._0_4_ = fVar94 * auVar206._0_4_;
  auVar234._4_4_ = fVar94 * auVar206._4_4_;
  auVar234._8_4_ = fVar94 * auVar206._8_4_;
  auVar234._12_4_ = fVar94 * auVar206._12_4_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar87 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar103);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar87 * 5 + 6);
  auVar10 = vpmovsxbd_avx2(auVar206);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar87 * 6 + 6);
  auVar108 = vpmovsxbd_avx2(auVar2);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar11 = vpmovsxbd_avx2(auVar3);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar12 = vpmovsxbd_avx2(auVar132);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar87 + 6);
  auVar172 = vpmovsxbd_avx2(auVar4);
  auVar172 = vcvtdq2ps_avx(auVar172);
  uVar92 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar201 = vpmovsxbd_avx2(auVar142);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar92 + uVar87 + 6);
  auVar174 = vpmovsxbd_avx2(auVar5);
  auVar174 = vcvtdq2ps_avx(auVar174);
  uVar92 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar146 = vpmovsxbd_avx2(auVar6);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar274._4_4_ = auVar234._0_4_;
  auVar274._0_4_ = auVar234._0_4_;
  auVar274._8_4_ = auVar234._0_4_;
  auVar274._12_4_ = auVar234._0_4_;
  auVar274._16_4_ = auVar234._0_4_;
  auVar274._20_4_ = auVar234._0_4_;
  auVar274._24_4_ = auVar234._0_4_;
  auVar274._28_4_ = auVar234._0_4_;
  auVar103 = vmovshdup_avx(auVar234);
  uVar97 = auVar103._0_8_;
  auVar285._8_8_ = uVar97;
  auVar285._0_8_ = uVar97;
  auVar285._16_8_ = uVar97;
  auVar285._24_8_ = uVar97;
  auVar103 = vshufps_avx(auVar234,auVar234,0xaa);
  fVar94 = auVar103._0_4_;
  auVar254._0_4_ = fVar94 * auVar108._0_4_;
  fVar125 = auVar103._4_4_;
  auVar254._4_4_ = fVar125 * auVar108._4_4_;
  auVar254._8_4_ = fVar94 * auVar108._8_4_;
  auVar254._12_4_ = fVar125 * auVar108._12_4_;
  auVar254._16_4_ = fVar94 * auVar108._16_4_;
  auVar254._20_4_ = fVar125 * auVar108._20_4_;
  auVar254._28_36_ = in_ZMM12._28_36_;
  auVar254._24_4_ = fVar94 * auVar108._24_4_;
  auVar215._0_4_ = auVar172._0_4_ * fVar94;
  auVar215._4_4_ = auVar172._4_4_ * fVar125;
  auVar215._8_4_ = auVar172._8_4_ * fVar94;
  auVar215._12_4_ = auVar172._12_4_ * fVar125;
  auVar215._16_4_ = auVar172._16_4_ * fVar94;
  auVar215._20_4_ = auVar172._20_4_ * fVar125;
  auVar215._28_36_ = in_ZMM10._28_36_;
  auVar215._24_4_ = auVar172._24_4_ * fVar94;
  auVar106._0_4_ = auVar146._0_4_ * fVar94;
  auVar106._4_4_ = auVar146._4_4_ * fVar125;
  auVar106._8_4_ = auVar146._8_4_ * fVar94;
  auVar106._12_4_ = auVar146._12_4_ * fVar125;
  auVar106._16_4_ = auVar146._16_4_ * fVar94;
  auVar106._20_4_ = auVar146._20_4_ * fVar125;
  auVar106._24_4_ = auVar146._24_4_ * fVar94;
  auVar106._28_4_ = 0;
  auVar103 = vfmadd231ps_fma(auVar254._0_32_,auVar285,auVar10);
  auVar206 = vfmadd231ps_fma(auVar215._0_32_,auVar285,auVar12);
  auVar2 = vfmadd231ps_fma(auVar106,auVar174,auVar285);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar274,auVar117);
  auVar206 = vfmadd231ps_fma(ZEXT1632(auVar206),auVar274,auVar11);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar201,auVar274);
  auVar199._4_4_ = auVar98._0_4_;
  auVar199._0_4_ = auVar98._0_4_;
  auVar199._8_4_ = auVar98._0_4_;
  auVar199._12_4_ = auVar98._0_4_;
  auVar199._16_4_ = auVar98._0_4_;
  auVar199._20_4_ = auVar98._0_4_;
  auVar199._24_4_ = auVar98._0_4_;
  auVar199._28_4_ = auVar98._0_4_;
  auVar103 = vmovshdup_avx(auVar98);
  uVar97 = auVar103._0_8_;
  auVar286._8_8_ = uVar97;
  auVar286._0_8_ = uVar97;
  auVar286._16_8_ = uVar97;
  auVar286._24_8_ = uVar97;
  auVar103 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar94 = auVar103._0_4_;
  auVar236._0_4_ = fVar94 * auVar108._0_4_;
  fVar125 = auVar103._4_4_;
  auVar236._4_4_ = fVar125 * auVar108._4_4_;
  auVar236._8_4_ = fVar94 * auVar108._8_4_;
  auVar236._12_4_ = fVar125 * auVar108._12_4_;
  auVar236._16_4_ = fVar94 * auVar108._16_4_;
  auVar236._20_4_ = fVar125 * auVar108._20_4_;
  auVar236._24_4_ = fVar94 * auVar108._24_4_;
  auVar236._28_4_ = 0;
  auVar230._4_4_ = auVar172._4_4_ * fVar125;
  auVar230._0_4_ = auVar172._0_4_ * fVar94;
  auVar230._8_4_ = auVar172._8_4_ * fVar94;
  auVar230._12_4_ = auVar172._12_4_ * fVar125;
  auVar230._16_4_ = auVar172._16_4_ * fVar94;
  auVar230._20_4_ = auVar172._20_4_ * fVar125;
  auVar230._24_4_ = auVar172._24_4_ * fVar94;
  auVar230._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar146._4_4_ * fVar125;
  auVar108._0_4_ = auVar146._0_4_ * fVar94;
  auVar108._8_4_ = auVar146._8_4_ * fVar94;
  auVar108._12_4_ = auVar146._12_4_ * fVar125;
  auVar108._16_4_ = auVar146._16_4_ * fVar94;
  auVar108._20_4_ = auVar146._20_4_ * fVar125;
  auVar108._24_4_ = auVar146._24_4_ * fVar94;
  auVar108._28_4_ = fVar125;
  auVar103 = vfmadd231ps_fma(auVar236,auVar286,auVar10);
  auVar132 = vfmadd231ps_fma(auVar230,auVar286,auVar12);
  auVar4 = vfmadd231ps_fma(auVar108,auVar286,auVar174);
  auVar142 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar199,auVar117);
  local_780._8_4_ = 0x7fffffff;
  local_780._0_8_ = 0x7fffffff7fffffff;
  local_780._12_4_ = 0x7fffffff;
  local_780._16_4_ = 0x7fffffff;
  local_780._20_4_ = 0x7fffffff;
  local_780._24_4_ = 0x7fffffff;
  local_780._28_4_ = 0x7fffffff;
  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar199,auVar11);
  auVar117 = vandps_avx(ZEXT1632(auVar3),local_780);
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar196._16_4_ = 0x219392ef;
  auVar196._20_4_ = 0x219392ef;
  auVar196._24_4_ = 0x219392ef;
  auVar196._28_4_ = 0x219392ef;
  auVar117 = vcmpps_avx(auVar117,auVar196,1);
  auVar10 = vblendvps_avx(ZEXT1632(auVar3),auVar196,auVar117);
  auVar117 = vandps_avx(ZEXT1632(auVar206),local_780);
  auVar117 = vcmpps_avx(auVar117,auVar196,1);
  auVar108 = vblendvps_avx(ZEXT1632(auVar206),auVar196,auVar117);
  auVar117 = vandps_avx(ZEXT1632(auVar2),local_780);
  auVar117 = vcmpps_avx(auVar117,auVar196,1);
  auVar11 = vrcpps_avx(auVar10);
  auVar117 = vblendvps_avx(ZEXT1632(auVar2),auVar196,auVar117);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = &DAT_3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar199,auVar201);
  auVar12 = vrcpps_avx(auVar108);
  auVar103 = vfnmadd213ps_fma(auVar10,auVar11,auVar109);
  auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar11,auVar11);
  auVar206 = vfnmadd213ps_fma(auVar108,auVar12,auVar109);
  auVar206 = vfmadd132ps_fma(ZEXT1632(auVar206),auVar12,auVar12);
  auVar10 = vrcpps_avx(auVar117);
  auVar2 = vfnmadd213ps_fma(auVar117,auVar10,auVar109);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 7 + 6));
  auVar2 = vfmadd132ps_fma(ZEXT1632(auVar2),auVar10,auVar10);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar142));
  auVar11._4_4_ = auVar103._4_4_ * auVar117._4_4_;
  auVar11._0_4_ = auVar103._0_4_ * auVar117._0_4_;
  auVar11._8_4_ = auVar103._8_4_ * auVar117._8_4_;
  auVar11._12_4_ = auVar103._12_4_ * auVar117._12_4_;
  auVar11._16_4_ = auVar117._16_4_ * 0.0;
  auVar11._20_4_ = auVar117._20_4_ * 0.0;
  auVar11._24_4_ = auVar117._24_4_ * 0.0;
  auVar11._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar142));
  auVar227._0_4_ = auVar103._0_4_ * auVar117._0_4_;
  auVar227._4_4_ = auVar103._4_4_ * auVar117._4_4_;
  auVar227._8_4_ = auVar103._8_4_ * auVar117._8_4_;
  auVar227._12_4_ = auVar103._12_4_ * auVar117._12_4_;
  auVar227._16_4_ = auVar117._16_4_ * 0.0;
  auVar227._20_4_ = auVar117._20_4_ * 0.0;
  auVar227._24_4_ = auVar117._24_4_ * 0.0;
  auVar227._28_4_ = 0;
  auVar146._1_3_ = 0;
  auVar146[0] = PVar7;
  auVar10 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar7 * 0x10 + uVar87 * -2 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar132));
  auVar12._4_4_ = auVar117._4_4_ * auVar206._4_4_;
  auVar12._0_4_ = auVar117._0_4_ * auVar206._0_4_;
  auVar12._8_4_ = auVar117._8_4_ * auVar206._8_4_;
  auVar12._12_4_ = auVar117._12_4_ * auVar206._12_4_;
  auVar12._16_4_ = auVar117._16_4_ * 0.0;
  auVar12._20_4_ = auVar117._20_4_ * 0.0;
  auVar12._24_4_ = auVar117._24_4_ * 0.0;
  auVar12._28_4_ = auVar117._28_4_;
  auVar117 = vcvtdq2ps_avx(auVar10);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar132));
  auVar172._4_4_ = auVar206._4_4_ * auVar117._4_4_;
  auVar172._0_4_ = auVar206._0_4_ * auVar117._0_4_;
  auVar172._8_4_ = auVar206._8_4_ * auVar117._8_4_;
  auVar172._12_4_ = auVar206._12_4_ * auVar117._12_4_;
  auVar172._16_4_ = auVar117._16_4_ * 0.0;
  auVar172._20_4_ = auVar117._20_4_ * 0.0;
  auVar172._24_4_ = auVar117._24_4_ * 0.0;
  auVar172._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 + uVar87 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar3));
  auVar201._4_4_ = auVar117._4_4_ * auVar2._4_4_;
  auVar201._0_4_ = auVar117._0_4_ * auVar2._0_4_;
  auVar201._8_4_ = auVar117._8_4_ * auVar2._8_4_;
  auVar201._12_4_ = auVar117._12_4_ * auVar2._12_4_;
  auVar201._16_4_ = auVar117._16_4_ * 0.0;
  auVar201._20_4_ = auVar117._20_4_ * 0.0;
  auVar201._24_4_ = auVar117._24_4_ * 0.0;
  auVar201._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar3));
  auVar174._4_4_ = auVar2._4_4_ * auVar117._4_4_;
  auVar174._0_4_ = auVar2._0_4_ * auVar117._0_4_;
  auVar174._8_4_ = auVar2._8_4_ * auVar117._8_4_;
  auVar174._12_4_ = auVar2._12_4_ * auVar117._12_4_;
  auVar174._16_4_ = auVar117._16_4_ * 0.0;
  auVar174._20_4_ = auVar117._20_4_ * 0.0;
  auVar174._24_4_ = auVar117._24_4_ * 0.0;
  auVar174._28_4_ = auVar117._28_4_;
  auVar117 = vpminsd_avx2(auVar11,auVar227);
  auVar10 = vpminsd_avx2(auVar12,auVar172);
  auVar117 = vmaxps_avx(auVar117,auVar10);
  auVar10 = vpminsd_avx2(auVar201,auVar174);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar256._4_4_ = uVar93;
  auVar256._0_4_ = uVar93;
  auVar256._8_4_ = uVar93;
  auVar256._12_4_ = uVar93;
  auVar256._16_4_ = uVar93;
  auVar256._20_4_ = uVar93;
  auVar256._24_4_ = uVar93;
  auVar256._28_4_ = uVar93;
  auVar10 = vmaxps_avx(auVar10,auVar256);
  auVar117 = vmaxps_avx(auVar117,auVar10);
  local_320._4_4_ = auVar117._4_4_ * 0.99999964;
  local_320._0_4_ = auVar117._0_4_ * 0.99999964;
  local_320._8_4_ = auVar117._8_4_ * 0.99999964;
  local_320._12_4_ = auVar117._12_4_ * 0.99999964;
  local_320._16_4_ = auVar117._16_4_ * 0.99999964;
  local_320._20_4_ = auVar117._20_4_ * 0.99999964;
  local_320._24_4_ = auVar117._24_4_ * 0.99999964;
  local_320._28_4_ = 0x3f7ffffa;
  auVar117 = vpmaxsd_avx2(auVar11,auVar227);
  auVar10 = vpmaxsd_avx2(auVar12,auVar172);
  auVar117 = vminps_avx(auVar117,auVar10);
  auVar10 = vpmaxsd_avx2(auVar201,auVar174);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar168._4_4_ = uVar93;
  auVar168._0_4_ = uVar93;
  auVar168._8_4_ = uVar93;
  auVar168._12_4_ = uVar93;
  auVar168._16_4_ = uVar93;
  auVar168._20_4_ = uVar93;
  auVar168._24_4_ = uVar93;
  auVar168._28_4_ = uVar93;
  auVar10 = vminps_avx(auVar10,auVar168);
  auVar117 = vminps_avx(auVar117,auVar10);
  auVar10._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar10._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar10._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar10._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar10._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar10._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar10._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar10._28_4_ = auVar117._28_4_;
  auVar146[4] = PVar7;
  auVar146._5_3_ = 0;
  auVar146[8] = PVar7;
  auVar146._9_3_ = 0;
  auVar146[0xc] = PVar7;
  auVar146._13_3_ = 0;
  auVar146[0x10] = PVar7;
  auVar146._17_3_ = 0;
  auVar146[0x14] = PVar7;
  auVar146._21_3_ = 0;
  auVar146[0x18] = PVar7;
  auVar146._25_3_ = 0;
  auVar146[0x1c] = PVar7;
  auVar146._29_3_ = 0;
  auVar117 = vcmpps_avx(local_320,auVar10,2);
  auVar10 = vpcmpgtd_avx2(auVar146,_DAT_0205a920);
  auVar117 = vandps_avx(auVar117,auVar10);
  uVar88 = vmovmskps_avx(auVar117);
  local_bc1 = uVar88 != 0;
  if (uVar88 == 0) {
    return local_bc1;
  }
  uVar88 = uVar88 & 0xff;
  local_7f8 = prim + lVar90 + 0x16;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_260 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_a00 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_7f0 = prim;
LAB_01818eda:
  lVar90 = 0;
  local_7e8 = (ulong)uVar88;
  for (uVar87 = local_7e8; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
    lVar90 = lVar90 + 1;
  }
  local_7e8 = local_7e8 - 1 & local_7e8;
  local_680 = *(undefined4 *)(local_7f0 + lVar90 * 4 + 6);
  uVar87 = (ulong)(uint)((int)lVar90 << 6);
  auVar103 = *(undefined1 (*) [16])(local_7f8 + uVar87);
  if (local_7e8 != 0) {
    uVar89 = local_7e8 - 1 & local_7e8;
    for (uVar92 = local_7e8; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
    }
    if (uVar89 != 0) {
      for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar206 = *(undefined1 (*) [16])(local_7f8 + uVar87 + 0x10);
  auVar2 = *(undefined1 (*) [16])(local_7f8 + uVar87 + 0x20);
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar4 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar277._4_4_ = uVar93;
  auVar277._0_4_ = uVar93;
  auVar277._8_4_ = uVar93;
  auVar277._12_4_ = uVar93;
  fStack_a70 = (float)uVar93;
  _local_a80 = auVar277;
  fStack_a6c = (float)uVar93;
  fStack_a68 = (float)uVar93;
  register0x0000159c = uVar93;
  auVar3 = *(undefined1 (*) [16])(local_7f8 + uVar87 + 0x30);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar284._4_4_ = uVar93;
  auVar284._0_4_ = uVar93;
  auVar284._8_4_ = uVar93;
  auVar284._12_4_ = uVar93;
  fStack_8f0 = (float)uVar93;
  _local_900 = auVar284;
  fStack_8ec = (float)uVar93;
  fStack_8e8 = (float)uVar93;
  register0x000015dc = uVar93;
  auVar132 = vunpcklps_avx(auVar277,auVar284);
  fVar94 = *(float *)(ray + k * 4 + 0x60);
  auVar265._4_4_ = fVar94;
  auVar265._0_4_ = fVar94;
  auVar265._8_4_ = fVar94;
  auVar265._12_4_ = fVar94;
  local_9c0._16_4_ = fVar94;
  local_9c0._0_16_ = auVar265;
  local_9c0._20_4_ = fVar94;
  local_9c0._24_4_ = fVar94;
  local_9c0._28_4_ = fVar94;
  auVar266 = ZEXT3264(local_9c0);
  local_930 = vinsertps_avx(auVar132,auVar265,0x28);
  auVar222._0_4_ = (auVar103._0_4_ + auVar206._0_4_ + auVar2._0_4_ + auVar3._0_4_) * 0.25;
  auVar222._4_4_ = (auVar103._4_4_ + auVar206._4_4_ + auVar2._4_4_ + auVar3._4_4_) * 0.25;
  auVar222._8_4_ = (auVar103._8_4_ + auVar206._8_4_ + auVar2._8_4_ + auVar3._8_4_) * 0.25;
  auVar222._12_4_ = (auVar103._12_4_ + auVar206._12_4_ + auVar2._12_4_ + auVar3._12_4_) * 0.25;
  auVar132 = vsubps_avx(auVar222,auVar4);
  auVar132 = vdpps_avx(auVar132,local_930,0x7f);
  local_940 = vdpps_avx(local_930,local_930,0x7f);
  auVar258 = ZEXT1664(local_940);
  local_670 = *(uint *)(local_7f0 + 2);
  local_9f8 = (ulong)local_670;
  auVar142 = vrcpss_avx(local_940,local_940);
  auVar5 = vfnmadd213ss_fma(auVar142,local_940,ZEXT416(0x40000000));
  local_300 = auVar132._0_4_ * auVar142._0_4_ * auVar5._0_4_;
  auVar235._4_4_ = local_300;
  auVar235._0_4_ = local_300;
  auVar235._8_4_ = local_300;
  auVar235._12_4_ = local_300;
  fStack_8b0 = local_300;
  _local_8c0 = auVar235;
  fStack_8ac = local_300;
  fStack_8a8 = local_300;
  fStack_8a4 = local_300;
  auVar132 = vfmadd231ps_fma(auVar4,local_930,auVar235);
  auVar132 = vblendps_avx(auVar132,_DAT_01feba10,8);
  local_a90 = vsubps_avx(auVar103,auVar132);
  local_aa0 = vsubps_avx(auVar2,auVar132);
  local_ab0 = vsubps_avx(auVar206,auVar132);
  _local_ac0 = vsubps_avx(auVar3,auVar132);
  auVar103 = vmovshdup_avx(local_a90);
  local_9a0 = auVar103._0_8_;
  auVar103 = vshufps_avx(local_a90,local_a90,0xaa);
  local_580 = auVar103._0_8_;
  auVar103 = vshufps_avx(local_a90,local_a90,0xff);
  local_1a0 = auVar103._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar103 = vmovshdup_avx(local_ab0);
  uVar97 = auVar103._0_8_;
  auVar242._8_8_ = uVar97;
  auVar242._0_8_ = uVar97;
  auVar242._16_8_ = uVar97;
  auVar242._24_8_ = uVar97;
  auVar103 = vshufps_avx(local_ab0,local_ab0,0xaa);
  uVar97 = auVar103._0_8_;
  auVar260._8_8_ = uVar97;
  auVar260._0_8_ = uVar97;
  auVar260._16_8_ = uVar97;
  auVar260._24_8_ = uVar97;
  auVar103 = vshufps_avx(local_ab0,local_ab0,0xff);
  uVar97 = auVar103._0_8_;
  auVar271._8_8_ = uVar97;
  auVar271._0_8_ = uVar97;
  auVar271._16_8_ = uVar97;
  auVar271._24_8_ = uVar97;
  auVar103 = vmovshdup_avx(local_aa0);
  local_1c0 = auVar103._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar103 = vshufps_avx(local_aa0,local_aa0,0xaa);
  uVar97 = auVar103._0_8_;
  local_400._8_8_ = uVar97;
  local_400._0_8_ = uVar97;
  local_400._16_8_ = uVar97;
  local_400._24_8_ = uVar97;
  auVar103 = vshufps_avx(local_aa0,local_aa0,0xff);
  local_3e0 = auVar103._0_4_;
  fStack_3dc = auVar103._4_4_;
  auVar103 = vmovshdup_avx(_local_ac0);
  local_1e0 = auVar103._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar103 = vshufps_avx(_local_ac0,_local_ac0,0xaa);
  local_200 = auVar103._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar103 = vshufps_avx(_local_ac0,_local_ac0,0xff);
  local_220 = auVar103._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar103 = vfmadd231ps_fma(ZEXT432((uint)(fVar94 * fVar94)),_local_900,_local_900);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),_local_a80,_local_a80);
  uVar93 = auVar103._0_4_;
  local_240._4_4_ = uVar93;
  local_240._0_4_ = uVar93;
  local_240._8_4_ = uVar93;
  local_240._12_4_ = uVar93;
  local_240._16_4_ = uVar93;
  local_240._20_4_ = uVar93;
  local_240._24_4_ = uVar93;
  local_240._28_4_ = uVar93;
  fVar94 = *(float *)(ray + k * 4 + 0x30);
  local_820 = ZEXT416((uint)local_300);
  local_300 = fVar94 - local_300;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_5a0 = 1;
  uVar87 = 0;
  uVar92 = 0;
  uVar93 = local_a90._0_4_;
  local_280._4_4_ = uVar93;
  local_280._0_4_ = uVar93;
  local_280._8_4_ = uVar93;
  local_280._12_4_ = uVar93;
  local_280._16_4_ = uVar93;
  local_280._20_4_ = uVar93;
  local_280._24_4_ = uVar93;
  local_280._28_4_ = uVar93;
  uVar93 = local_ab0._0_4_;
  local_2a0._4_4_ = uVar93;
  local_2a0._0_4_ = uVar93;
  local_2a0._8_4_ = uVar93;
  local_2a0._12_4_ = uVar93;
  local_2a0._16_4_ = uVar93;
  local_2a0._20_4_ = uVar93;
  local_2a0._24_4_ = uVar93;
  local_2a0._28_4_ = uVar93;
  uVar93 = local_aa0._0_4_;
  local_2c0._4_4_ = uVar93;
  local_2c0._0_4_ = uVar93;
  local_2c0._8_4_ = uVar93;
  local_2c0._12_4_ = uVar93;
  local_2c0._16_4_ = uVar93;
  local_2c0._20_4_ = uVar93;
  local_2c0._24_4_ = uVar93;
  local_2c0._28_4_ = uVar93;
  local_2e0 = local_ac0._0_4_;
  auVar1._8_8_ = local_580;
  auVar1._0_8_ = local_580;
  auVar1._16_8_ = local_580;
  auVar1._24_8_ = local_580;
  local_420 = vandps_avx(local_240,local_780);
  auVar103 = vsqrtss_avx(local_940,local_940);
  local_b04 = auVar103._0_4_;
  auVar103 = vsqrtss_avx(local_940,local_940);
  local_b08 = auVar103._0_4_;
  local_810 = ZEXT816(0x3f80000000000000);
  auVar215 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar254 = ZEXT3264(CONCAT824(local_9a0,CONCAT816(local_9a0,CONCAT88(local_9a0,local_9a0))));
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_ae0 = auVar271;
  local_a40 = auVar260;
  local_a20 = auVar242;
  uStack_998 = local_9a0;
  uStack_990 = local_9a0;
  uStack_988 = local_9a0;
  uStack_67c = local_680;
  uStack_678 = local_680;
  uStack_674 = local_680;
  uStack_66c = local_670;
  uStack_668 = local_670;
  uStack_664 = local_670;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  fStack_3d8 = local_3e0;
  fStack_3d4 = fStack_3dc;
  fStack_3d0 = local_3e0;
  fStack_3cc = fStack_3dc;
  fStack_3c8 = local_3e0;
  fStack_3c4 = fStack_3dc;
  do {
    auVar103 = vmovshdup_avx(local_810);
    local_8e0._0_4_ = local_810._0_4_;
    fVar157 = auVar103._0_4_ - local_8e0._0_4_;
    fVar161 = fVar157 * 0.04761905;
    local_8e0._4_4_ = local_8e0._0_4_;
    local_8e0._8_4_ = local_8e0._0_4_;
    local_8e0._12_4_ = local_8e0._0_4_;
    local_8e0._16_4_ = local_8e0._0_4_;
    local_8e0._20_4_ = local_8e0._0_4_;
    local_8e0._24_4_ = local_8e0._0_4_;
    local_8e0._28_4_ = local_8e0._0_4_;
    local_6c0._4_4_ = fVar157;
    local_6c0._0_4_ = fVar157;
    local_6c0._8_4_ = fVar157;
    local_6c0._12_4_ = fVar157;
    local_6c0._16_4_ = fVar157;
    local_6c0._20_4_ = fVar157;
    local_6c0._24_4_ = fVar157;
    local_6c0._28_4_ = fVar157;
    auVar103 = vfmadd231ps_fma(local_8e0,local_6c0,_DAT_02020f20);
    auVar117 = vsubps_avx(auVar215._0_32_,ZEXT1632(auVar103));
    fVar125 = auVar103._0_4_;
    auVar281._0_4_ = local_2a0._0_4_ * fVar125;
    fVar95 = auVar103._4_4_;
    auVar281._4_4_ = local_2a0._4_4_ * fVar95;
    fVar156 = auVar103._8_4_;
    auVar281._8_4_ = local_2a0._8_4_ * fVar156;
    fVar96 = auVar103._12_4_;
    auVar281._12_4_ = local_2a0._12_4_ * fVar96;
    auVar281._16_4_ = local_2a0._16_4_ * 0.0;
    auVar281._20_4_ = local_2a0._20_4_ * 0.0;
    auVar281._28_36_ = auVar266._28_36_;
    auVar281._24_4_ = local_2a0._24_4_ * 0.0;
    auVar261._0_4_ = auVar242._0_4_ * fVar125;
    auVar261._4_4_ = auVar242._4_4_ * fVar95;
    auVar261._8_4_ = auVar242._8_4_ * fVar156;
    auVar261._12_4_ = auVar242._12_4_ * fVar96;
    auVar261._16_4_ = auVar242._16_4_ * 0.0;
    auVar261._20_4_ = auVar242._20_4_ * 0.0;
    auVar261._28_36_ = auVar258._28_36_;
    auVar261._24_4_ = auVar242._24_4_ * 0.0;
    auVar258._0_4_ = auVar260._0_4_ * fVar125;
    auVar258._4_4_ = auVar260._4_4_ * fVar95;
    auVar258._8_4_ = auVar260._8_4_ * fVar156;
    auVar258._12_4_ = auVar260._12_4_ * fVar96;
    auVar258._16_4_ = auVar260._16_4_ * 0.0;
    auVar258._20_4_ = auVar260._20_4_ * 0.0;
    auVar258._28_36_ = auVar215._28_36_;
    auVar258._24_4_ = auVar260._24_4_ * 0.0;
    auVar14._4_4_ = auVar271._4_4_ * fVar95;
    auVar14._0_4_ = auVar271._0_4_ * fVar125;
    auVar14._8_4_ = auVar271._8_4_ * fVar156;
    auVar14._12_4_ = auVar271._12_4_ * fVar96;
    auVar14._16_4_ = auVar271._16_4_ * 0.0;
    auVar14._20_4_ = auVar271._20_4_ * 0.0;
    auVar14._24_4_ = auVar271._24_4_ * 0.0;
    auVar14._28_4_ = fVar157;
    auVar103 = vfmadd231ps_fma(auVar281._0_32_,auVar117,local_280);
    auVar206 = vfmadd231ps_fma(auVar261._0_32_,auVar117,auVar254._0_32_);
    auVar2 = vfmadd231ps_fma(auVar258._0_32_,auVar117,auVar1);
    auVar82._8_8_ = uStack_198;
    auVar82._0_8_ = local_1a0;
    auVar82._16_8_ = uStack_190;
    auVar82._24_8_ = uStack_188;
    auVar3 = vfmadd231ps_fma(auVar14,auVar117,auVar82);
    auVar266._0_4_ = local_2c0._0_4_ * fVar125;
    auVar266._4_4_ = local_2c0._4_4_ * fVar95;
    auVar266._8_4_ = local_2c0._8_4_ * fVar156;
    auVar266._12_4_ = local_2c0._12_4_ * fVar96;
    auVar266._16_4_ = local_2c0._16_4_ * 0.0;
    auVar266._20_4_ = local_2c0._20_4_ * 0.0;
    auVar266._28_36_ = auVar254._28_36_;
    auVar266._24_4_ = local_2c0._24_4_ * 0.0;
    auVar81._8_8_ = uStack_1b8;
    auVar81._0_8_ = local_1c0;
    auVar81._16_8_ = uStack_1b0;
    auVar81._24_8_ = uStack_1a8;
    auVar15._4_4_ = (float)((ulong)local_1c0 >> 0x20) * fVar95;
    auVar15._0_4_ = (float)local_1c0 * fVar125;
    auVar15._8_4_ = (float)uStack_1b8 * fVar156;
    auVar15._12_4_ = (float)((ulong)uStack_1b8 >> 0x20) * fVar96;
    auVar15._16_4_ = (float)uStack_1b0 * 0.0;
    auVar15._20_4_ = (float)((ulong)uStack_1b0 >> 0x20) * 0.0;
    auVar15._24_4_ = (float)uStack_1a8 * 0.0;
    auVar15._28_4_ = local_2c0._28_4_;
    auVar211._0_4_ = local_400._0_4_ * fVar125;
    auVar211._4_4_ = local_400._4_4_ * fVar95;
    auVar211._8_4_ = local_400._8_4_ * fVar156;
    auVar211._12_4_ = local_400._12_4_ * fVar96;
    auVar211._16_4_ = local_400._16_4_ * 0.0;
    auVar211._20_4_ = local_400._20_4_ * 0.0;
    auVar211._24_4_ = local_400._24_4_ * 0.0;
    auVar211._28_4_ = 0;
    auVar68._4_4_ = fVar95 * fStack_3dc;
    auVar68._0_4_ = fVar125 * local_3e0;
    auVar68._8_4_ = fVar156 * fStack_3d8;
    auVar68._12_4_ = fVar96 * fStack_3d4;
    auVar68._16_4_ = fStack_3d0 * 0.0;
    auVar68._20_4_ = fStack_3cc * 0.0;
    auVar68._24_4_ = fStack_3c8 * 0.0;
    auVar68._28_4_ = auVar1._28_4_;
    auVar132 = vfmadd231ps_fma(auVar266._0_32_,auVar117,local_2a0);
    auVar4 = vfmadd231ps_fma(auVar15,auVar117,auVar242);
    auVar142 = vfmadd231ps_fma(auVar211,auVar117,auVar260);
    auVar5 = vfmadd231ps_fma(auVar68,auVar117,auVar271);
    auVar16._4_4_ = fStack_2dc * fVar95;
    auVar16._0_4_ = local_2e0 * fVar125;
    auVar16._8_4_ = fStack_2d8 * fVar156;
    auVar16._12_4_ = fStack_2d4 * fVar96;
    auVar16._16_4_ = fStack_2d0 * 0.0;
    auVar16._20_4_ = fStack_2cc * 0.0;
    auVar16._24_4_ = fStack_2c8 * 0.0;
    auVar16._28_4_ = auVar260._28_4_;
    auVar17._4_4_ = fVar95 * local_1e0._4_4_;
    auVar17._0_4_ = fVar125 * (float)local_1e0;
    auVar17._8_4_ = fVar156 * (float)uStack_1d8;
    auVar17._12_4_ = fVar96 * uStack_1d8._4_4_;
    auVar17._16_4_ = (float)uStack_1d0 * 0.0;
    auVar17._20_4_ = uStack_1d0._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_1c8 * 0.0;
    auVar17._28_4_ = auVar271._28_4_;
    auVar18._28_4_ = local_400._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar132._12_4_ * fVar96,
                            CONCAT48(auVar132._8_4_ * fVar156,
                                     CONCAT44(auVar132._4_4_ * fVar95,auVar132._0_4_ * fVar125))));
    auVar103 = vfmadd231ps_fma(auVar18,auVar117,ZEXT1632(auVar103));
    auVar206 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar4._12_4_,
                                                  CONCAT48(fVar156 * auVar4._8_4_,
                                                           CONCAT44(fVar95 * auVar4._4_4_,
                                                                    fVar125 * auVar4._0_4_)))),
                               auVar117,ZEXT1632(auVar206));
    auVar19._28_4_ = local_2a0._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar96 * auVar142._12_4_,
                            CONCAT48(fVar156 * auVar142._8_4_,
                                     CONCAT44(fVar95 * auVar142._4_4_,fVar125 * auVar142._0_4_))));
    auVar2 = vfmadd231ps_fma(auVar19,auVar117,ZEXT1632(auVar2));
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar5._12_4_,
                                                CONCAT48(fVar156 * auVar5._8_4_,
                                                         CONCAT44(fVar95 * auVar5._4_4_,
                                                                  fVar125 * auVar5._0_4_)))),
                             auVar117,ZEXT1632(auVar3));
    auVar20._4_4_ = fVar95 * local_200._4_4_;
    auVar20._0_4_ = fVar125 * (float)local_200;
    auVar20._8_4_ = fVar156 * (float)uStack_1f8;
    auVar20._12_4_ = fVar96 * uStack_1f8._4_4_;
    auVar20._16_4_ = (float)uStack_1f0 * 0.0;
    auVar20._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar20._24_4_ = (float)uStack_1e8 * 0.0;
    auVar20._28_4_ = auVar242._28_4_;
    auVar6 = vfmadd231ps_fma(auVar16,auVar117,local_2c0);
    auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar96,
                                                  CONCAT48(auVar6._8_4_ * fVar156,
                                                           CONCAT44(auVar6._4_4_ * fVar95,
                                                                    auVar6._0_4_ * fVar125)))),
                               auVar117,ZEXT1632(auVar132));
    auVar252._0_4_ = fVar125 * (float)local_220;
    auVar252._4_4_ = fVar95 * local_220._4_4_;
    auVar252._8_4_ = fVar156 * (float)uStack_218;
    auVar252._12_4_ = fVar96 * uStack_218._4_4_;
    auVar252._16_4_ = (float)uStack_210 * 0.0;
    auVar252._20_4_ = uStack_210._4_4_ * 0.0;
    auVar252._24_4_ = (float)uStack_208 * 0.0;
    auVar252._28_4_ = 0;
    auVar6 = vfmadd231ps_fma(auVar17,auVar117,auVar81);
    auVar98 = vfmadd231ps_fma(auVar20,auVar117,local_400);
    auVar79._4_4_ = fStack_3dc;
    auVar79._0_4_ = local_3e0;
    auVar79._8_4_ = fStack_3d8;
    auVar79._12_4_ = fStack_3d4;
    auVar79._16_4_ = fStack_3d0;
    auVar79._20_4_ = fStack_3cc;
    auVar79._24_4_ = fStack_3c8;
    auVar79._28_4_ = fStack_3c4;
    auVar234 = vfmadd231ps_fma(auVar252,auVar117,auVar79);
    auVar21._28_4_ = fStack_2c4;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar234._12_4_ * fVar96,
                            CONCAT48(auVar234._8_4_ * fVar156,
                                     CONCAT44(auVar234._4_4_ * fVar95,auVar234._0_4_ * fVar125))));
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar96,
                                                CONCAT48(auVar6._8_4_ * fVar156,
                                                         CONCAT44(auVar6._4_4_ * fVar95,
                                                                  auVar6._0_4_ * fVar125)))),
                             auVar117,ZEXT1632(auVar4));
    auVar142 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar98._12_4_,
                                                  CONCAT48(fVar156 * auVar98._8_4_,
                                                           CONCAT44(fVar95 * auVar98._4_4_,
                                                                    fVar125 * auVar98._0_4_)))),
                               auVar117,ZEXT1632(auVar142));
    auVar5 = vfmadd231ps_fma(auVar21,auVar117,ZEXT1632(auVar5));
    auVar22._28_4_ = local_2c0._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar96,
                            CONCAT48(auVar4._8_4_ * fVar156,
                                     CONCAT44(auVar4._4_4_ * fVar95,auVar4._0_4_ * fVar125))));
    auVar23._28_4_ = (int)((ulong)uStack_1a8 >> 0x20);
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(fVar96 * auVar142._12_4_,
                            CONCAT48(fVar156 * auVar142._8_4_,
                                     CONCAT44(fVar95 * auVar142._4_4_,fVar125 * auVar142._0_4_))));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar132._12_4_ * fVar96,
                                                CONCAT48(auVar132._8_4_ * fVar156,
                                                         CONCAT44(auVar132._4_4_ * fVar95,
                                                                  auVar132._0_4_ * fVar125)))),
                             auVar117,ZEXT1632(auVar103));
    auVar98 = vfmadd231ps_fma(auVar22,auVar117,ZEXT1632(auVar206));
    auVar106 = ZEXT1632(auVar98);
    auVar98 = vfmadd231ps_fma(auVar23,auVar117,ZEXT1632(auVar2));
    auVar234 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar96,
                                                  CONCAT48(auVar5._8_4_ * fVar156,
                                                           CONCAT44(auVar5._4_4_ * fVar95,
                                                                    auVar5._0_4_ * fVar125)))),
                               ZEXT1632(auVar3),auVar117);
    auVar10 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar103));
    auVar117 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar206));
    auVar108 = vsubps_avx(ZEXT1632(auVar142),ZEXT1632(auVar2));
    auVar11 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar3));
    local_a60._0_4_ = fVar161 * auVar10._0_4_ * 3.0;
    local_a60._4_4_ = fVar161 * auVar10._4_4_ * 3.0;
    local_a60._8_4_ = fVar161 * auVar10._8_4_ * 3.0;
    local_a60._12_4_ = fVar161 * auVar10._12_4_ * 3.0;
    local_a60._16_4_ = fVar161 * auVar10._16_4_ * 3.0;
    local_a60._20_4_ = fVar161 * auVar10._20_4_ * 3.0;
    local_a60._24_4_ = fVar161 * auVar10._24_4_ * 3.0;
    local_a60._28_4_ = 0;
    local_6a0._0_4_ = fVar161 * auVar117._0_4_ * 3.0;
    local_6a0._4_4_ = fVar161 * auVar117._4_4_ * 3.0;
    local_6a0._8_4_ = fVar161 * auVar117._8_4_ * 3.0;
    local_6a0._12_4_ = fVar161 * auVar117._12_4_ * 3.0;
    local_6a0._16_4_ = fVar161 * auVar117._16_4_ * 3.0;
    local_6a0._20_4_ = fVar161 * auVar117._20_4_ * 3.0;
    local_6a0._24_4_ = fVar161 * auVar117._24_4_ * 3.0;
    local_6a0._28_4_ = 0;
    local_b00._0_4_ = fVar161 * auVar108._0_4_ * 3.0;
    local_b00._4_4_ = fVar161 * auVar108._4_4_ * 3.0;
    local_b00._8_4_ = fVar161 * auVar108._8_4_ * 3.0;
    local_b00._12_4_ = fVar161 * auVar108._12_4_ * 3.0;
    local_b00._16_4_ = fVar161 * auVar108._16_4_ * 3.0;
    local_b00._20_4_ = fVar161 * auVar108._20_4_ * 3.0;
    local_b00._24_4_ = fVar161 * auVar108._24_4_ * 3.0;
    local_b00._28_4_ = 0;
    fVar125 = fVar161 * auVar11._0_4_ * 3.0;
    fVar156 = fVar161 * auVar11._4_4_ * 3.0;
    auVar24._4_4_ = fVar156;
    auVar24._0_4_ = fVar125;
    fVar157 = fVar161 * auVar11._8_4_ * 3.0;
    auVar24._8_4_ = fVar157;
    fVar158 = fVar161 * auVar11._12_4_ * 3.0;
    auVar24._12_4_ = fVar158;
    fVar159 = fVar161 * auVar11._16_4_ * 3.0;
    auVar24._16_4_ = fVar159;
    fVar160 = fVar161 * auVar11._20_4_ * 3.0;
    auVar24._20_4_ = fVar160;
    fVar161 = fVar161 * auVar11._24_4_ * 3.0;
    auVar24._24_4_ = fVar161;
    auVar24._28_4_ = auVar10._28_4_;
    auVar196 = ZEXT1632(auVar6);
    local_840 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar6));
    local_860 = vpermps_avx2(_DAT_0205d4a0,auVar106);
    _local_880 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar98));
    auVar12 = vsubps_avx(local_840,auVar196);
    auVar172 = vsubps_avx(_local_880,ZEXT1632(auVar98));
    fVar178 = auVar172._0_4_;
    fVar179 = auVar172._4_4_;
    auVar25._4_4_ = fVar179 * local_a60._4_4_;
    auVar25._0_4_ = fVar178 * local_a60._0_4_;
    fVar180 = auVar172._8_4_;
    auVar25._8_4_ = fVar180 * local_a60._8_4_;
    fVar181 = auVar172._12_4_;
    auVar25._12_4_ = fVar181 * local_a60._12_4_;
    fVar220 = auVar172._16_4_;
    auVar25._16_4_ = fVar220 * local_a60._16_4_;
    fVar221 = auVar172._20_4_;
    auVar25._20_4_ = fVar221 * local_a60._20_4_;
    fVar259 = auVar172._24_4_;
    auVar25._24_4_ = fVar259 * local_a60._24_4_;
    auVar25._28_4_ = local_880._28_4_;
    auVar103 = vfmsub231ps_fma(auVar25,local_b00,auVar12);
    auVar201 = vsubps_avx(local_860,auVar106);
    fVar262 = auVar12._0_4_;
    fVar263 = auVar12._4_4_;
    auVar26._4_4_ = fVar263 * local_6a0._4_4_;
    auVar26._0_4_ = fVar262 * local_6a0._0_4_;
    fVar264 = auVar12._8_4_;
    auVar26._8_4_ = fVar264 * local_6a0._8_4_;
    fVar267 = auVar12._12_4_;
    auVar26._12_4_ = fVar267 * local_6a0._12_4_;
    fVar268 = auVar12._16_4_;
    auVar26._16_4_ = fVar268 * local_6a0._16_4_;
    fVar269 = auVar12._20_4_;
    auVar26._20_4_ = fVar269 * local_6a0._20_4_;
    fVar270 = auVar12._24_4_;
    auVar26._24_4_ = fVar270 * local_6a0._24_4_;
    auVar26._28_4_ = local_840._28_4_;
    auVar206 = vfmsub231ps_fma(auVar26,local_a60,auVar201);
    auVar103 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar206._12_4_ * auVar206._12_4_,
                                                  CONCAT48(auVar206._8_4_ * auVar206._8_4_,
                                                           CONCAT44(auVar206._4_4_ * auVar206._4_4_,
                                                                    auVar206._0_4_ * auVar206._0_4_)
                                                          ))),ZEXT1632(auVar103),ZEXT1632(auVar103))
    ;
    fVar204 = auVar201._0_4_;
    fVar216 = auVar201._4_4_;
    auVar27._4_4_ = fVar216 * local_b00._4_4_;
    auVar27._0_4_ = fVar204 * (float)local_b00._0_4_;
    fVar217 = auVar201._8_4_;
    auVar27._8_4_ = fVar217 * local_b00._8_4_;
    fVar218 = auVar201._12_4_;
    auVar27._12_4_ = fVar218 * local_b00._12_4_;
    fVar219 = auVar201._16_4_;
    auVar27._16_4_ = fVar219 * local_b00._16_4_;
    fVar240 = auVar201._20_4_;
    auVar27._20_4_ = fVar240 * local_b00._20_4_;
    fVar246 = auVar201._24_4_;
    auVar27._24_4_ = fVar246 * local_b00._24_4_;
    auVar27._28_4_ = local_860._28_4_;
    auVar2 = vfmsub231ps_fma(auVar27,local_6a0,auVar172);
    auVar197._0_4_ = fVar178 * fVar178;
    auVar197._4_4_ = fVar179 * fVar179;
    auVar197._8_4_ = fVar180 * fVar180;
    auVar197._12_4_ = fVar181 * fVar181;
    auVar197._16_4_ = fVar220 * fVar220;
    auVar197._20_4_ = fVar221 * fVar221;
    auVar197._24_4_ = fVar259 * fVar259;
    auVar197._28_4_ = 0;
    auVar206 = vfmadd231ps_fma(auVar197,auVar201,auVar201);
    auVar206 = vfmadd231ps_fma(ZEXT1632(auVar206),auVar12,auVar12);
    auVar117 = vrcpps_avx(ZEXT1632(auVar206));
    auVar2 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT1632(auVar2),ZEXT1632(auVar2));
    auVar275._8_4_ = 0x3f800000;
    auVar275._0_8_ = &DAT_3f8000003f800000;
    auVar275._12_4_ = 0x3f800000;
    auVar275._16_4_ = 0x3f800000;
    auVar275._20_4_ = 0x3f800000;
    auVar275._24_4_ = 0x3f800000;
    auVar275._28_4_ = 0x3f800000;
    auVar103 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar206),auVar275);
    auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar117,auVar117);
    local_960 = vpermps_avx2(_DAT_0205d4a0,local_a60);
    local_980 = vpermps_avx2(_DAT_0205d4a0,local_b00);
    auVar28._4_4_ = fVar179 * local_960._4_4_;
    auVar28._0_4_ = fVar178 * local_960._0_4_;
    auVar28._8_4_ = fVar180 * local_960._8_4_;
    auVar28._12_4_ = fVar181 * local_960._12_4_;
    auVar28._16_4_ = fVar220 * local_960._16_4_;
    auVar28._20_4_ = fVar221 * local_960._20_4_;
    auVar28._24_4_ = fVar259 * local_960._24_4_;
    auVar28._28_4_ = auVar117._28_4_;
    auVar3 = vfmsub231ps_fma(auVar28,local_980,auVar12);
    local_8a0 = vpermps_avx2(_DAT_0205d4a0,local_6a0);
    auVar29._4_4_ = fVar263 * local_8a0._4_4_;
    auVar29._0_4_ = fVar262 * local_8a0._0_4_;
    auVar29._8_4_ = fVar264 * local_8a0._8_4_;
    auVar29._12_4_ = fVar267 * local_8a0._12_4_;
    auVar29._16_4_ = fVar268 * local_8a0._16_4_;
    auVar29._20_4_ = fVar269 * local_8a0._20_4_;
    auVar29._24_4_ = fVar270 * local_8a0._24_4_;
    auVar29._28_4_ = 0;
    auVar132 = vfmsub231ps_fma(auVar29,local_960,auVar201);
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar132._12_4_ * auVar132._12_4_,
                                                CONCAT48(auVar132._8_4_ * auVar132._8_4_,
                                                         CONCAT44(auVar132._4_4_ * auVar132._4_4_,
                                                                  auVar132._0_4_ * auVar132._0_4_)))
                                     ),ZEXT1632(auVar3),ZEXT1632(auVar3));
    fVar95 = local_980._0_4_;
    auVar228._0_4_ = fVar204 * fVar95;
    fVar96 = local_980._4_4_;
    auVar228._4_4_ = fVar216 * fVar96;
    fVar282 = local_980._8_4_;
    auVar228._8_4_ = fVar217 * fVar282;
    fVar283 = local_980._12_4_;
    auVar228._12_4_ = fVar218 * fVar283;
    fVar289 = local_980._16_4_;
    auVar228._16_4_ = fVar219 * fVar289;
    fVar290 = local_980._20_4_;
    auVar228._20_4_ = fVar240 * fVar290;
    fVar291 = local_980._24_4_;
    auVar228._24_4_ = fVar246 * fVar291;
    auVar228._28_4_ = 0;
    auVar132 = vfmsub231ps_fma(auVar228,local_8a0,auVar172);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),ZEXT1632(auVar132),ZEXT1632(auVar132));
    auVar117 = vmaxps_avx(ZEXT1632(CONCAT412(auVar2._12_4_ * auVar103._12_4_,
                                             CONCAT48(auVar2._8_4_ * auVar103._8_4_,
                                                      CONCAT44(auVar2._4_4_ * auVar103._4_4_,
                                                               auVar2._0_4_ * auVar103._0_4_)))),
                          ZEXT1632(CONCAT412(auVar3._12_4_ * auVar103._12_4_,
                                             CONCAT48(auVar3._8_4_ * auVar103._8_4_,
                                                      CONCAT44(auVar3._4_4_ * auVar103._4_4_,
                                                               auVar3._0_4_ * auVar103._0_4_)))));
    local_700._0_4_ = auVar234._0_4_ + fVar125;
    local_700._4_4_ = auVar234._4_4_ + fVar156;
    local_700._8_4_ = auVar234._8_4_ + fVar157;
    local_700._12_4_ = auVar234._12_4_ + fVar158;
    local_700._16_4_ = fVar159 + 0.0;
    local_700._20_4_ = fVar160 + 0.0;
    local_700._24_4_ = fVar161 + 0.0;
    local_700._28_4_ = auVar10._28_4_ + 0.0;
    local_6e0 = ZEXT1632(auVar234);
    auVar10 = vsubps_avx(local_6e0,auVar24);
    auVar236 = vpermps_avx2(_DAT_0205d4a0,auVar10);
    auStack_710 = auVar236._16_16_;
    local_740 = vpermps_avx2(_DAT_0205d4a0,local_6e0);
    auVar10 = vmaxps_avx(local_6e0,local_700);
    auVar108 = vmaxps_avx(auVar236,local_740);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar206));
    auVar10 = vmaxps_avx(auVar10,auVar108);
    fVar125 = auVar11._0_4_;
    fVar156 = auVar11._4_4_;
    fVar161 = auVar11._8_4_;
    fVar157 = auVar11._12_4_;
    fVar158 = auVar11._16_4_;
    fVar159 = auVar11._20_4_;
    fVar160 = auVar11._24_4_;
    auVar30._4_4_ = fVar156 * fVar156 * fVar156 * auVar206._4_4_ * -0.5;
    auVar30._0_4_ = fVar125 * fVar125 * fVar125 * auVar206._0_4_ * -0.5;
    auVar30._8_4_ = fVar161 * fVar161 * fVar161 * auVar206._8_4_ * -0.5;
    auVar30._12_4_ = fVar157 * fVar157 * fVar157 * auVar206._12_4_ * -0.5;
    auVar30._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
    auVar30._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
    auVar30._24_4_ = fVar160 * fVar160 * fVar160 * -0.0;
    auVar30._28_4_ = local_980._28_4_;
    auVar107._8_4_ = 0x3fc00000;
    auVar107._0_8_ = 0x3fc000003fc00000;
    auVar107._12_4_ = 0x3fc00000;
    auVar107._16_4_ = 0x3fc00000;
    auVar107._20_4_ = 0x3fc00000;
    auVar107._24_4_ = 0x3fc00000;
    auVar107._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_fma(auVar30,auVar107,auVar11);
    fVar156 = auVar103._0_4_;
    fVar161 = auVar103._4_4_;
    auVar31._4_4_ = fVar216 * fVar161;
    auVar31._0_4_ = fVar204 * fVar156;
    fVar158 = auVar103._8_4_;
    auVar31._8_4_ = fVar217 * fVar158;
    fVar160 = auVar103._12_4_;
    auVar31._12_4_ = fVar218 * fVar160;
    auVar31._16_4_ = fVar219 * 0.0;
    auVar31._20_4_ = fVar240 * 0.0;
    auVar31._24_4_ = fVar246 * 0.0;
    auVar31._28_4_ = 0;
    fVar240 = local_9c0._0_4_;
    fVar246 = local_9c0._4_4_;
    auVar32._4_4_ = fVar246 * fVar179 * fVar161;
    auVar32._0_4_ = fVar240 * fVar178 * fVar156;
    fVar247 = local_9c0._8_4_;
    auVar32._8_4_ = fVar247 * fVar180 * fVar158;
    fVar248 = local_9c0._12_4_;
    auVar32._12_4_ = fVar248 * fVar181 * fVar160;
    fVar249 = local_9c0._16_4_;
    auVar32._16_4_ = fVar249 * fVar220 * 0.0;
    fVar250 = local_9c0._20_4_;
    auVar32._20_4_ = fVar250 * fVar221 * 0.0;
    fVar251 = local_9c0._24_4_;
    auVar32._24_4_ = fVar251 * fVar259 * 0.0;
    auVar32._28_4_ = auVar172._28_4_;
    auVar206 = vfmadd231ps_fma(auVar32,auVar31,_local_900);
    auVar274 = ZEXT1632(auVar98);
    auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar174 = vsubps_avx(auVar108,auVar274);
    fVar204 = auVar174._0_4_;
    fVar216 = auVar174._4_4_;
    auVar33._4_4_ = fVar216 * fVar179 * fVar161;
    auVar33._0_4_ = fVar204 * fVar178 * fVar156;
    fVar217 = auVar174._8_4_;
    auVar33._8_4_ = fVar217 * fVar180 * fVar158;
    fVar218 = auVar174._12_4_;
    auVar33._12_4_ = fVar218 * fVar181 * fVar160;
    fVar219 = auVar174._16_4_;
    auVar33._16_4_ = fVar219 * fVar220 * 0.0;
    fVar220 = auVar174._20_4_;
    auVar33._20_4_ = fVar220 * fVar221 * 0.0;
    fVar221 = auVar174._24_4_;
    auVar33._24_4_ = fVar221 * fVar259 * 0.0;
    auVar33._28_4_ = local_960._28_4_;
    auVar146 = vsubps_avx(auVar108,auVar106);
    auVar2 = vfmadd231ps_fma(auVar33,auVar146,auVar31);
    auVar34._4_4_ = fVar263 * fVar161;
    auVar34._0_4_ = fVar262 * fVar156;
    auVar34._8_4_ = fVar264 * fVar158;
    auVar34._12_4_ = fVar267 * fVar160;
    auVar34._16_4_ = fVar268 * 0.0;
    auVar34._20_4_ = fVar269 * 0.0;
    auVar34._24_4_ = fVar270 * 0.0;
    auVar34._28_4_ = auVar11._28_4_;
    auVar206 = vfmadd231ps_fma(ZEXT1632(auVar206),auVar34,_local_a80);
    auVar109 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar230 = vsubps_avx(auVar109,auVar196);
    auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar230,auVar34);
    auVar35._4_4_ = fVar246 * fVar216;
    auVar35._0_4_ = fVar240 * fVar204;
    auVar35._8_4_ = fVar247 * fVar217;
    auVar35._12_4_ = fVar248 * fVar218;
    auVar35._16_4_ = fVar249 * fVar219;
    auVar35._20_4_ = fVar250 * fVar220;
    auVar35._24_4_ = fVar251 * fVar221;
    auVar35._28_4_ = auVar11._28_4_;
    auVar3 = vfmadd231ps_fma(auVar35,_local_900,auVar146);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_a80,auVar230);
    fVar125 = auVar2._0_4_;
    fVar259 = auVar206._0_4_;
    fVar157 = auVar2._4_4_;
    fVar262 = auVar206._4_4_;
    fVar159 = auVar2._8_4_;
    fVar263 = auVar206._8_4_;
    fVar178 = auVar2._12_4_;
    fVar264 = auVar206._12_4_;
    auVar36._28_4_ = local_a80._28_4_;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(fVar264 * fVar178,
                            CONCAT48(fVar263 * fVar159,CONCAT44(fVar262 * fVar157,fVar259 * fVar125)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar3),auVar36);
    auVar37._4_4_ = fVar216 * fVar216;
    auVar37._0_4_ = fVar204 * fVar204;
    auVar37._8_4_ = fVar217 * fVar217;
    auVar37._12_4_ = fVar218 * fVar218;
    auVar37._16_4_ = fVar219 * fVar219;
    auVar37._20_4_ = fVar220 * fVar220;
    auVar37._24_4_ = fVar221 * fVar221;
    auVar37._28_4_ = local_a80._28_4_;
    auVar3 = vfmadd231ps_fma(auVar37,auVar146,auVar146);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar230,auVar230);
    auVar38._28_4_ = auVar12._28_4_;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(fVar178 * fVar178,
                            CONCAT48(fVar159 * fVar159,CONCAT44(fVar157 * fVar157,fVar125 * fVar125)
                                    )));
    auVar168 = vsubps_avx(ZEXT1632(auVar3),auVar38);
    auVar108 = vsqrtps_avx(auVar117);
    fVar125 = (auVar10._0_4_ + auVar108._0_4_) * 1.0000002;
    fVar157 = (auVar10._4_4_ + auVar108._4_4_) * 1.0000002;
    fVar159 = (auVar10._8_4_ + auVar108._8_4_) * 1.0000002;
    fVar178 = (auVar10._12_4_ + auVar108._12_4_) * 1.0000002;
    fVar179 = (auVar10._16_4_ + auVar108._16_4_) * 1.0000002;
    fVar180 = (auVar10._20_4_ + auVar108._20_4_) * 1.0000002;
    fVar181 = (auVar10._24_4_ + auVar108._24_4_) * 1.0000002;
    auVar39._4_4_ = fVar157 * fVar157;
    auVar39._0_4_ = fVar125 * fVar125;
    auVar39._8_4_ = fVar159 * fVar159;
    auVar39._12_4_ = fVar178 * fVar178;
    auVar39._16_4_ = fVar179 * fVar179;
    auVar39._20_4_ = fVar180 * fVar180;
    auVar39._24_4_ = fVar181 * fVar181;
    auVar39._28_4_ = auVar10._28_4_ + auVar108._28_4_;
    fVar157 = auVar11._0_4_ + auVar11._0_4_;
    fVar159 = auVar11._4_4_ + auVar11._4_4_;
    local_920._0_8_ = CONCAT44(fVar159,fVar157);
    local_920._8_4_ = auVar11._8_4_ + auVar11._8_4_;
    local_920._12_4_ = auVar11._12_4_ + auVar11._12_4_;
    local_920._16_4_ = auVar11._16_4_ + auVar11._16_4_;
    local_920._20_4_ = auVar11._20_4_ + auVar11._20_4_;
    local_920._24_4_ = auVar11._24_4_ + auVar11._24_4_;
    fVar125 = auVar11._28_4_;
    local_920._28_4_ = fVar125 + fVar125;
    auVar10 = vsubps_avx(auVar168,auVar39);
    auVar256 = ZEXT1632(auVar206);
    auVar40._28_4_ = local_900._28_4_;
    auVar40._0_28_ =
         ZEXT1628(CONCAT412(fVar264 * fVar264,
                            CONCAT48(fVar263 * fVar263,CONCAT44(fVar262 * fVar262,fVar259 * fVar259)
                                    )));
    auVar266 = ZEXT3264(local_240);
    auVar11 = vsubps_avx(local_240,auVar40);
    auVar41._4_4_ = fVar159 * fVar159;
    auVar41._0_4_ = fVar157 * fVar157;
    auVar41._8_4_ = local_920._8_4_ * local_920._8_4_;
    auVar41._12_4_ = local_920._12_4_ * local_920._12_4_;
    auVar41._16_4_ = local_920._16_4_ * local_920._16_4_;
    auVar41._20_4_ = local_920._20_4_ * local_920._20_4_;
    auVar41._24_4_ = local_920._24_4_ * local_920._24_4_;
    auVar41._28_4_ = fVar125;
    fVar178 = auVar11._0_4_;
    fVar179 = auVar11._4_4_;
    fVar180 = auVar11._8_4_;
    fVar181 = auVar11._12_4_;
    fVar259 = auVar11._16_4_;
    fVar262 = auVar11._20_4_;
    fVar263 = auVar11._24_4_;
    auVar42._4_4_ = auVar10._4_4_ * fVar179 * 4.0;
    auVar42._0_4_ = auVar10._0_4_ * fVar178 * 4.0;
    auVar42._8_4_ = auVar10._8_4_ * fVar180 * 4.0;
    auVar42._12_4_ = auVar10._12_4_ * fVar181 * 4.0;
    auVar42._16_4_ = auVar10._16_4_ * fVar259 * 4.0;
    auVar42._20_4_ = auVar10._20_4_ * fVar262 * 4.0;
    auVar42._24_4_ = auVar10._24_4_ * fVar263 * 4.0;
    auVar42._28_4_ = 0x40800000;
    auVar227 = vsubps_avx(auVar41,auVar42);
    auVar117 = vcmpps_avx(auVar227,auVar109,5);
    auVar109 = ZEXT1632(auVar2);
    fVar125 = auVar11._28_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      auVar257._8_4_ = 0x7f800000;
      auVar257._0_8_ = 0x7f8000007f800000;
      auVar257._12_4_ = 0x7f800000;
      auVar257._16_4_ = 0x7f800000;
      auVar257._20_4_ = 0x7f800000;
      auVar257._24_4_ = 0x7f800000;
      auVar257._28_4_ = 0x7f800000;
      auVar229._8_4_ = 0xff800000;
      auVar229._0_8_ = 0xff800000ff800000;
      auVar229._12_4_ = 0xff800000;
      auVar229._16_4_ = 0xff800000;
      auVar229._20_4_ = 0xff800000;
      auVar229._24_4_ = 0xff800000;
      auVar229._28_4_ = 0xff800000;
    }
    else {
      auVar286 = vsqrtps_avx(auVar227);
      auVar243._0_4_ = fVar178 + fVar178;
      auVar243._4_4_ = fVar179 + fVar179;
      auVar243._8_4_ = fVar180 + fVar180;
      auVar243._12_4_ = fVar181 + fVar181;
      auVar243._16_4_ = fVar259 + fVar259;
      auVar243._20_4_ = fVar262 + fVar262;
      auVar243._24_4_ = fVar263 + fVar263;
      auVar243._28_4_ = fVar125 + fVar125;
      auVar285 = vrcpps_avx(auVar243);
      auVar199 = vcmpps_avx(auVar227,ZEXT832(0) << 0x20,5);
      auVar266 = ZEXT3264(auVar199);
      auVar169._8_4_ = 0x3f800000;
      auVar169._0_8_ = &DAT_3f8000003f800000;
      auVar169._12_4_ = 0x3f800000;
      auVar169._16_4_ = 0x3f800000;
      auVar169._20_4_ = 0x3f800000;
      auVar169._24_4_ = 0x3f800000;
      auVar169._28_4_ = 0x3f800000;
      auVar206 = vfnmadd213ps_fma(auVar243,auVar285,auVar169);
      auVar206 = vfmadd132ps_fma(ZEXT1632(auVar206),auVar285,auVar285);
      auVar110._0_8_ = CONCAT44(fVar159,fVar157) ^ 0x8000000080000000;
      auVar110._8_4_ = -local_920._8_4_;
      auVar110._12_4_ = -local_920._12_4_;
      auVar110._16_4_ = -local_920._16_4_;
      auVar110._20_4_ = -local_920._20_4_;
      auVar110._24_4_ = -local_920._24_4_;
      auVar110._28_4_ = -local_920._28_4_;
      auVar227 = vsubps_avx(auVar110,auVar286);
      auVar43._4_4_ = auVar227._4_4_ * auVar206._4_4_;
      auVar43._0_4_ = auVar227._0_4_ * auVar206._0_4_;
      auVar43._8_4_ = auVar227._8_4_ * auVar206._8_4_;
      auVar43._12_4_ = auVar227._12_4_ * auVar206._12_4_;
      auVar43._16_4_ = auVar227._16_4_ * 0.0;
      auVar43._20_4_ = auVar227._20_4_ * 0.0;
      auVar43._24_4_ = auVar227._24_4_ * 0.0;
      auVar43._28_4_ = auVar227._28_4_;
      auVar227 = vsubps_avx(auVar286,local_920);
      auVar44._4_4_ = auVar227._4_4_ * auVar206._4_4_;
      auVar44._0_4_ = auVar227._0_4_ * auVar206._0_4_;
      auVar44._8_4_ = auVar227._8_4_ * auVar206._8_4_;
      auVar44._12_4_ = auVar227._12_4_ * auVar206._12_4_;
      auVar44._16_4_ = auVar227._16_4_ * 0.0;
      auVar44._20_4_ = auVar227._20_4_ * 0.0;
      auVar44._24_4_ = auVar227._24_4_ * 0.0;
      auVar44._28_4_ = auVar227._28_4_;
      auVar206 = vfmadd213ps_fma(auVar256,auVar43,auVar109);
      local_440 = ZEXT1632(CONCAT412(fVar160 * auVar206._12_4_,
                                     CONCAT48(fVar158 * auVar206._8_4_,
                                              CONCAT44(fVar161 * auVar206._4_4_,
                                                       fVar156 * auVar206._0_4_))));
      auVar206 = vfmadd213ps_fma(auVar256,auVar44,auVar109);
      local_460 = ZEXT1632(CONCAT412(fVar160 * auVar206._12_4_,
                                     CONCAT48(fVar158 * auVar206._8_4_,
                                              CONCAT44(fVar161 * auVar206._4_4_,
                                                       fVar156 * auVar206._0_4_))));
      auVar170._8_4_ = 0x7f800000;
      auVar170._0_8_ = 0x7f8000007f800000;
      auVar170._12_4_ = 0x7f800000;
      auVar170._16_4_ = 0x7f800000;
      auVar170._20_4_ = 0x7f800000;
      auVar170._24_4_ = 0x7f800000;
      auVar170._28_4_ = 0x7f800000;
      auVar257 = vblendvps_avx(auVar170,auVar43,auVar199);
      auVar227 = vandps_avx(auVar40,local_780);
      auVar227 = vmaxps_avx(local_420,auVar227);
      auVar45._4_4_ = auVar227._4_4_ * 1.9073486e-06;
      auVar45._0_4_ = auVar227._0_4_ * 1.9073486e-06;
      auVar45._8_4_ = auVar227._8_4_ * 1.9073486e-06;
      auVar45._12_4_ = auVar227._12_4_ * 1.9073486e-06;
      auVar45._16_4_ = auVar227._16_4_ * 1.9073486e-06;
      auVar45._20_4_ = auVar227._20_4_ * 1.9073486e-06;
      auVar45._24_4_ = auVar227._24_4_ * 1.9073486e-06;
      auVar45._28_4_ = auVar227._28_4_;
      auVar227 = vandps_avx(auVar11,local_780);
      auVar227 = vcmpps_avx(auVar227,auVar45,1);
      auVar111._8_4_ = 0xff800000;
      auVar111._0_8_ = 0xff800000ff800000;
      auVar111._12_4_ = 0xff800000;
      auVar111._16_4_ = 0xff800000;
      auVar111._20_4_ = 0xff800000;
      auVar111._24_4_ = 0xff800000;
      auVar111._28_4_ = 0xff800000;
      auVar229 = vblendvps_avx(auVar111,auVar44,auVar199);
      auVar285 = auVar199 & auVar227;
      if ((((((((auVar285 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar285 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar285 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar285 >> 0x7f,0) != '\0') ||
            (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar285 >> 0xbf,0) != '\0') ||
          (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar285[0x1f] < '\0') {
        auVar117 = vandps_avx(auVar199,auVar227);
        auVar227 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,2);
        auVar272._8_4_ = 0xff800000;
        auVar272._0_8_ = 0xff800000ff800000;
        auVar272._12_4_ = 0xff800000;
        auVar272._16_4_ = 0xff800000;
        auVar272._20_4_ = 0xff800000;
        auVar272._24_4_ = 0xff800000;
        auVar272._28_4_ = 0xff800000;
        auVar288._8_4_ = 0x7f800000;
        auVar288._0_8_ = 0x7f8000007f800000;
        auVar288._12_4_ = 0x7f800000;
        auVar288._16_4_ = 0x7f800000;
        auVar288._20_4_ = 0x7f800000;
        auVar288._24_4_ = 0x7f800000;
        auVar288._28_4_ = 0x7f800000;
        auVar10 = vblendvps_avx(auVar288,auVar272,auVar227);
        auVar206 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar285 = vpmovsxwd_avx2(auVar206);
        auVar257 = vblendvps_avx(auVar257,auVar10,auVar285);
        auVar10 = vblendvps_avx(auVar272,auVar288,auVar227);
        auVar229 = vblendvps_avx(auVar229,auVar10,auVar285);
        auVar120._0_8_ = auVar117._0_8_ ^ 0xffffffffffffffff;
        auVar120._8_4_ = auVar117._8_4_ ^ 0xffffffff;
        auVar120._12_4_ = auVar117._12_4_ ^ 0xffffffff;
        auVar120._16_4_ = auVar117._16_4_ ^ 0xffffffff;
        auVar120._20_4_ = auVar117._20_4_ ^ 0xffffffff;
        auVar120._24_4_ = auVar117._24_4_ ^ 0xffffffff;
        auVar120._28_4_ = auVar117._28_4_ ^ 0xffffffff;
        auVar117 = vorps_avx(auVar227,auVar120);
        auVar117 = vandps_avx(auVar199,auVar117);
      }
    }
    auVar10 = local_260 & auVar117;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar10 >> 0x7f,0) == '\0') &&
          (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar10 >> 0xbf,0) == '\0') &&
        (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar10[0x1f]) {
LAB_018199e2:
      auVar215 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
      auVar254 = ZEXT3264(CONCAT824(uStack_988,CONCAT816(uStack_990,CONCAT88(uStack_998,local_9a0)))
                         );
      auVar258 = ZEXT3264(local_a20);
      auVar261 = ZEXT3264(local_a40);
      auVar281 = ZEXT3264(local_ae0);
    }
    else {
      local_340 = ZEXT1632(auVar103);
      fVar157 = *(float *)(ray + k * 4 + 0x80) - (float)local_820._0_4_;
      auVar112._4_4_ = fVar157;
      auVar112._0_4_ = fVar157;
      auVar112._8_4_ = fVar157;
      auVar112._12_4_ = fVar157;
      auVar112._16_4_ = fVar157;
      auVar112._20_4_ = fVar157;
      auVar112._24_4_ = fVar157;
      auVar112._28_4_ = fVar157;
      auVar227 = vminps_avx(auVar112,auVar229);
      auVar46._4_4_ = fVar216 * local_b00._4_4_;
      auVar46._0_4_ = fVar204 * (float)local_b00._0_4_;
      auVar46._8_4_ = fVar217 * local_b00._8_4_;
      auVar46._12_4_ = fVar218 * local_b00._12_4_;
      auVar46._16_4_ = fVar219 * local_b00._16_4_;
      auVar46._20_4_ = fVar220 * local_b00._20_4_;
      auVar46._24_4_ = fVar221 * local_b00._24_4_;
      auVar46._28_4_ = auVar174._28_4_;
      auVar103 = vfmadd213ps_fma(auVar146,local_6a0,auVar46);
      auVar206 = vfmadd213ps_fma(auVar230,local_a60,ZEXT1632(auVar103));
      auVar47._4_4_ = fVar246 * local_b00._4_4_;
      auVar47._0_4_ = fVar240 * (float)local_b00._0_4_;
      auVar47._8_4_ = fVar247 * local_b00._8_4_;
      auVar47._12_4_ = fVar248 * local_b00._12_4_;
      auVar47._16_4_ = fVar249 * local_b00._16_4_;
      auVar47._20_4_ = fVar250 * local_b00._20_4_;
      auVar47._24_4_ = fVar251 * local_b00._24_4_;
      auVar47._28_4_ = 0;
      auVar103 = vfmadd231ps_fma(auVar47,_local_900,local_6a0);
      auVar2 = vfmadd231ps_fma(ZEXT1632(auVar103),_local_a80,local_a60);
      auVar10 = vandps_avx(ZEXT1632(auVar2),local_780);
      auVar278._8_4_ = 0x219392ef;
      auVar278._0_8_ = 0x219392ef219392ef;
      auVar278._12_4_ = 0x219392ef;
      auVar278._16_4_ = 0x219392ef;
      auVar278._20_4_ = 0x219392ef;
      auVar278._24_4_ = 0x219392ef;
      auVar278._28_4_ = 0x219392ef;
      auVar174 = vcmpps_avx(auVar10,auVar278,1);
      auVar10 = vrcpps_avx(ZEXT1632(auVar2));
      auVar287._8_4_ = 0x3f800000;
      auVar287._0_8_ = &DAT_3f8000003f800000;
      auVar287._12_4_ = 0x3f800000;
      auVar287._16_4_ = 0x3f800000;
      auVar287._20_4_ = 0x3f800000;
      auVar287._24_4_ = 0x3f800000;
      auVar287._28_4_ = 0x3f800000;
      auVar230 = ZEXT1632(auVar2);
      auVar103 = vfnmadd213ps_fma(auVar10,auVar230,auVar287);
      auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar10,auVar10);
      auVar198._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
      auVar198._8_4_ = auVar2._8_4_ ^ 0x80000000;
      auVar198._12_4_ = auVar2._12_4_ ^ 0x80000000;
      auVar198._16_4_ = 0x80000000;
      auVar198._20_4_ = 0x80000000;
      auVar198._24_4_ = 0x80000000;
      auVar198._28_4_ = 0x80000000;
      auVar244._0_4_ = auVar103._0_4_ * -auVar206._0_4_;
      auVar244._4_4_ = auVar103._4_4_ * -auVar206._4_4_;
      auVar244._8_4_ = auVar103._8_4_ * -auVar206._8_4_;
      auVar244._12_4_ = auVar103._12_4_ * -auVar206._12_4_;
      auVar244._16_4_ = 0x80000000;
      auVar244._20_4_ = 0x80000000;
      auVar244._24_4_ = 0x80000000;
      auVar244._28_4_ = 0;
      auVar10 = vcmpps_avx(auVar230,auVar198,1);
      auVar10 = vorps_avx(auVar174,auVar10);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar10 = vblendvps_avx(auVar244,auVar279,auVar10);
      auVar80._4_4_ = fStack_2fc;
      auVar80._0_4_ = local_300;
      auVar80._8_4_ = fStack_2f8;
      auVar80._12_4_ = fStack_2f4;
      auVar80._16_4_ = fStack_2f0;
      auVar80._20_4_ = fStack_2ec;
      auVar80._24_4_ = fStack_2e8;
      auVar80._28_4_ = fStack_2e4;
      auVar146 = vmaxps_avx(auVar80,auVar257);
      auVar146 = vmaxps_avx(auVar146,auVar10);
      auVar10 = vcmpps_avx(auVar230,auVar198,6);
      auVar10 = vorps_avx(auVar174,auVar10);
      auVar280._8_4_ = 0x7f800000;
      auVar280._0_8_ = 0x7f8000007f800000;
      auVar280._12_4_ = 0x7f800000;
      auVar280._16_4_ = 0x7f800000;
      auVar280._20_4_ = 0x7f800000;
      auVar280._24_4_ = 0x7f800000;
      auVar280._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar244,auVar280,auVar10);
      auVar230 = vminps_avx(auVar227,auVar10);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,local_860);
      auVar174 = vsubps_avx(ZEXT832(0) << 0x20,_local_880);
      auVar48._4_4_ = auVar174._4_4_ * fVar96;
      auVar48._0_4_ = auVar174._0_4_ * fVar95;
      auVar48._8_4_ = auVar174._8_4_ * fVar282;
      auVar48._12_4_ = auVar174._12_4_ * fVar283;
      auVar48._16_4_ = auVar174._16_4_ * fVar289;
      auVar48._20_4_ = auVar174._20_4_ * fVar290;
      auVar48._24_4_ = auVar174._24_4_ * fVar291;
      auVar48._28_4_ = auVar174._28_4_;
      auVar103 = vfnmsub231ps_fma(auVar48,local_8a0,auVar10);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,local_840);
      auVar206 = vfnmadd231ps_fma(ZEXT1632(auVar103),local_960,auVar10);
      auVar49._4_4_ = fVar96 * fVar246;
      auVar49._0_4_ = fVar95 * fVar240;
      auVar49._8_4_ = fVar282 * fVar247;
      auVar49._12_4_ = fVar283 * fVar248;
      auVar49._16_4_ = fVar289 * fVar249;
      auVar49._20_4_ = fVar290 * fVar250;
      auVar49._24_4_ = fVar291 * fVar251;
      auVar49._28_4_ = auVar10._28_4_;
      auVar103 = vfnmsub231ps_fma(auVar49,_local_900,local_8a0);
      auVar2 = vfnmadd231ps_fma(ZEXT1632(auVar103),_local_a80,local_960);
      auVar10 = vandps_avx(ZEXT1632(auVar2),local_780);
      auVar227 = vrcpps_avx(ZEXT1632(auVar2));
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar113._16_4_ = 0x219392ef;
      auVar113._20_4_ = 0x219392ef;
      auVar113._24_4_ = 0x219392ef;
      auVar113._28_4_ = 0x219392ef;
      auVar174 = vcmpps_avx(auVar10,auVar113,1);
      auVar199 = ZEXT1632(auVar2);
      auVar103 = vfnmadd213ps_fma(auVar227,auVar199,auVar287);
      auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar227,auVar227);
      auVar245._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
      auVar245._8_4_ = auVar2._8_4_ ^ 0x80000000;
      auVar245._12_4_ = auVar2._12_4_ ^ 0x80000000;
      auVar245._16_4_ = 0x80000000;
      auVar245._20_4_ = 0x80000000;
      auVar245._24_4_ = 0x80000000;
      auVar245._28_4_ = 0x80000000;
      auVar50._4_4_ = auVar103._4_4_ * -auVar206._4_4_;
      auVar50._0_4_ = auVar103._0_4_ * -auVar206._0_4_;
      auVar50._8_4_ = auVar103._8_4_ * -auVar206._8_4_;
      auVar50._12_4_ = auVar103._12_4_ * -auVar206._12_4_;
      auVar50._16_4_ = 0x80000000;
      auVar50._20_4_ = 0x80000000;
      auVar50._24_4_ = 0x80000000;
      auVar50._28_4_ = 0x80000000;
      auVar10 = vcmpps_avx(auVar199,auVar245,1);
      auVar10 = vorps_avx(auVar10,auVar174);
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
      auVar10 = vblendvps_avx(auVar50,auVar114,auVar10);
      auVar266 = ZEXT3264(auVar10);
      _local_520 = vmaxps_avx(auVar146,auVar10);
      auVar10 = vcmpps_avx(auVar199,auVar245,6);
      auVar10 = vorps_avx(auVar174,auVar10);
      auVar10 = vblendvps_avx(auVar50,auVar280,auVar10);
      auVar117 = vandps_avx(auVar117,local_260);
      local_360 = vminps_avx(auVar230,auVar10);
      auVar10 = vcmpps_avx(_local_520,local_360,2);
      auVar174 = auVar117 & auVar10;
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar174 >> 0x7f,0) == '\0') &&
            (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar174 >> 0xbf,0) == '\0') &&
          (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar174[0x1f]) goto LAB_018199e2;
      auVar237._8_4_ = 0x3f800000;
      auVar237._0_8_ = &DAT_3f8000003f800000;
      auVar237._12_4_ = 0x3f800000;
      auVar237._16_4_ = 0x3f800000;
      auVar237._20_4_ = 0x3f800000;
      auVar237._24_4_ = 0x3f800000;
      auVar237._28_4_ = 0x3f800000;
      auVar174 = vminps_avx(local_440,auVar237);
      auVar67 = ZEXT812(0);
      auVar210 = ZEXT1228(auVar67) << 0x20;
      auVar174 = vmaxps_avx(auVar174,ZEXT1232(auVar67) << 0x20);
      auVar146 = vminps_avx(local_460,auVar237);
      auVar146 = vmaxps_avx(auVar146,ZEXT1232(auVar67) << 0x20);
      auVar52._4_4_ = (auVar174._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar174._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar174._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar174._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar174._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar174._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar174._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar174._28_4_ + 7.0;
      auVar103 = vfmadd213ps_fma(auVar52,local_6c0,local_8e0);
      auVar53._4_4_ = (auVar146._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar146._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar146._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar146._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar146._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar146._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar146._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar146._28_4_ + 7.0;
      auVar206 = vfmadd213ps_fma(auVar53,local_6c0,local_8e0);
      auVar174 = vminps_avx(local_6e0,local_700);
      auVar146 = vminps_avx(auVar236,local_740);
      auVar174 = vminps_avx(auVar174,auVar146);
      auVar108 = vsubps_avx(auVar174,auVar108);
      auVar117 = vandps_avx(auVar10,auVar117);
      local_440 = ZEXT1632(auVar103);
      local_460 = ZEXT1632(auVar206);
      auVar54._4_4_ = auVar108._4_4_ * 0.99999976;
      auVar54._0_4_ = auVar108._0_4_ * 0.99999976;
      auVar54._8_4_ = auVar108._8_4_ * 0.99999976;
      auVar54._12_4_ = auVar108._12_4_ * 0.99999976;
      auVar54._16_4_ = auVar108._16_4_ * 0.99999976;
      auVar54._20_4_ = auVar108._20_4_ * 0.99999976;
      auVar54._24_4_ = auVar108._24_4_ * 0.99999976;
      auVar54._28_4_ = 0x3f7ffffc;
      auVar10 = vmaxps_avx(ZEXT832(0) << 0x20,auVar54);
      auVar55._4_4_ = auVar10._4_4_ * auVar10._4_4_;
      auVar55._0_4_ = auVar10._0_4_ * auVar10._0_4_;
      auVar55._8_4_ = auVar10._8_4_ * auVar10._8_4_;
      auVar55._12_4_ = auVar10._12_4_ * auVar10._12_4_;
      auVar55._16_4_ = auVar10._16_4_ * auVar10._16_4_;
      auVar55._20_4_ = auVar10._20_4_ * auVar10._20_4_;
      auVar55._24_4_ = auVar10._24_4_ * auVar10._24_4_;
      auVar55._28_4_ = auVar10._28_4_;
      auVar108 = vsubps_avx(auVar168,auVar55);
      auVar266 = ZEXT3264(auVar108);
      auVar56._4_4_ = auVar108._4_4_ * fVar179 * 4.0;
      auVar56._0_4_ = auVar108._0_4_ * fVar178 * 4.0;
      auVar56._8_4_ = auVar108._8_4_ * fVar180 * 4.0;
      auVar56._12_4_ = auVar108._12_4_ * fVar181 * 4.0;
      auVar56._16_4_ = auVar108._16_4_ * fVar259 * 4.0;
      auVar56._20_4_ = auVar108._20_4_ * fVar262 * 4.0;
      auVar56._24_4_ = auVar108._24_4_ * fVar263 * 4.0;
      auVar56._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(auVar41,auVar56);
      local_bc0 = vcmpps_avx(auVar10,ZEXT1232(auVar67) << 0x20,5);
      if ((((((((local_bc0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_bc0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_bc0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_bc0 >> 0x7f,0) == '\0') &&
            (local_bc0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_bc0 >> 0xbf,0) == '\0') &&
          (local_bc0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_bc0[0x1f]) {
        auVar172 = SUB6432(ZEXT864(0),0) << 0x20;
        local_7c0 = ZEXT832(0) << 0x20;
        _local_7e0 = ZEXT832(0) << 0x20;
        auVar201 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar231._8_4_ = 0x7f800000;
        auVar231._0_8_ = 0x7f8000007f800000;
        auVar231._12_4_ = 0x7f800000;
        auVar231._16_4_ = 0x7f800000;
        auVar231._20_4_ = 0x7f800000;
        auVar231._24_4_ = 0x7f800000;
        auVar231._28_4_ = 0x7f800000;
        auVar238._8_4_ = 0xff800000;
        auVar238._0_8_ = 0xff800000ff800000;
        auVar238._12_4_ = 0xff800000;
        auVar238._16_4_ = 0xff800000;
        auVar238._20_4_ = 0xff800000;
        auVar238._24_4_ = 0xff800000;
        auVar238._28_4_ = 0xff800000;
        _local_7a0 = local_7c0;
      }
      else {
        auVar173._0_4_ = fVar178 + fVar178;
        auVar173._4_4_ = fVar179 + fVar179;
        auVar173._8_4_ = fVar180 + fVar180;
        auVar173._12_4_ = fVar181 + fVar181;
        auVar173._16_4_ = fVar259 + fVar259;
        auVar173._20_4_ = fVar262 + fVar262;
        auVar173._24_4_ = fVar263 + fVar263;
        auVar173._28_4_ = fVar125 + fVar125;
        auVar174 = vrcpps_avx(auVar173);
        auVar212._8_4_ = 0x3f800000;
        auVar212._0_8_ = &DAT_3f8000003f800000;
        auVar212._12_4_ = 0x3f800000;
        auVar212._16_4_ = 0x3f800000;
        auVar212._20_4_ = 0x3f800000;
        auVar212._24_4_ = 0x3f800000;
        auVar212._28_4_ = 0x3f800000;
        auVar103 = vfnmadd213ps_fma(auVar173,auVar174,auVar212);
        auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar174,auVar174);
        auVar174 = vsqrtps_avx(auVar10);
        auVar213._0_8_ = local_920._0_8_ ^ 0x8000000080000000;
        auVar213._8_4_ = -local_920._8_4_;
        auVar213._12_4_ = -local_920._12_4_;
        auVar213._16_4_ = -local_920._16_4_;
        auVar213._20_4_ = -local_920._20_4_;
        auVar213._24_4_ = -local_920._24_4_;
        auVar213._28_4_ = -local_920._28_4_;
        auVar146 = vsubps_avx(auVar213,auVar174);
        auVar174 = vsubps_avx(auVar174,local_920);
        fVar178 = auVar146._0_4_ * auVar103._0_4_;
        fVar289 = auVar146._4_4_ * auVar103._4_4_;
        auVar57._4_4_ = fVar289;
        auVar57._0_4_ = fVar178;
        fVar290 = auVar146._8_4_ * auVar103._8_4_;
        auVar57._8_4_ = fVar290;
        fVar291 = auVar146._12_4_ * auVar103._12_4_;
        auVar57._12_4_ = fVar291;
        fVar179 = auVar146._16_4_ * 0.0;
        auVar57._16_4_ = fVar179;
        fVar180 = auVar146._20_4_ * 0.0;
        auVar57._20_4_ = fVar180;
        fVar181 = auVar146._24_4_ * 0.0;
        auVar57._24_4_ = fVar181;
        auVar57._28_4_ = 0x3f800000;
        fVar125 = auVar174._0_4_ * auVar103._0_4_;
        fVar95 = auVar174._4_4_ * auVar103._4_4_;
        auVar58._4_4_ = fVar95;
        auVar58._0_4_ = fVar125;
        fVar96 = auVar174._8_4_ * auVar103._8_4_;
        auVar58._8_4_ = fVar96;
        fVar157 = auVar174._12_4_ * auVar103._12_4_;
        auVar58._12_4_ = fVar157;
        fVar282 = auVar174._16_4_ * 0.0;
        auVar58._16_4_ = fVar282;
        fVar159 = auVar174._20_4_ * 0.0;
        auVar58._20_4_ = fVar159;
        fVar283 = auVar174._24_4_ * 0.0;
        auVar58._24_4_ = fVar283;
        auVar58._28_4_ = local_ae0._28_4_;
        auVar103 = vfmadd213ps_fma(auVar256,auVar57,auVar109);
        auVar206 = vfmadd213ps_fma(auVar256,auVar58,auVar109);
        auVar59._28_4_ = auVar146._28_4_;
        auVar59._0_28_ =
             ZEXT1628(CONCAT412(fVar160 * auVar103._12_4_,
                                CONCAT48(fVar158 * auVar103._8_4_,
                                         CONCAT44(fVar161 * auVar103._4_4_,fVar156 * auVar103._0_4_)
                                        )));
        auVar174 = ZEXT1632(CONCAT412(fVar160 * auVar206._12_4_,
                                      CONCAT48(fVar158 * auVar206._8_4_,
                                               CONCAT44(fVar161 * auVar206._4_4_,
                                                        fVar156 * auVar206._0_4_))));
        auVar103 = vfmadd213ps_fma(auVar12,auVar59,auVar196);
        auVar206 = vfmadd213ps_fma(auVar12,auVar174,auVar196);
        auVar2 = vfmadd213ps_fma(auVar201,auVar59,auVar106);
        auVar3 = vfmadd213ps_fma(auVar201,auVar174,auVar106);
        auVar132 = vfmadd213ps_fma(auVar59,auVar172,auVar274);
        auVar4 = vfmadd213ps_fma(auVar172,auVar174,auVar274);
        auVar60._4_4_ = fVar289 * (float)local_a80._4_4_;
        auVar60._0_4_ = fVar178 * (float)local_a80._0_4_;
        auVar60._8_4_ = fVar290 * fStack_a78;
        auVar60._12_4_ = fVar291 * fStack_a74;
        auVar60._16_4_ = fVar179 * fStack_a70;
        auVar60._20_4_ = fVar180 * fStack_a6c;
        auVar60._24_4_ = fVar181 * fStack_a68;
        auVar60._28_4_ = 0;
        auVar172 = vsubps_avx(auVar60,ZEXT1632(auVar103));
        auVar202._0_4_ = fVar178 * (float)local_900._0_4_;
        auVar202._4_4_ = fVar289 * (float)local_900._4_4_;
        auVar202._8_4_ = fVar290 * fStack_8f8;
        auVar202._12_4_ = fVar291 * fStack_8f4;
        auVar202._16_4_ = fVar179 * fStack_8f0;
        auVar202._20_4_ = fVar180 * fStack_8ec;
        auVar202._24_4_ = fVar181 * fStack_8e8;
        auVar202._28_4_ = 0;
        auVar201 = vsubps_avx(auVar202,ZEXT1632(auVar2));
        auVar232._0_4_ = fVar240 * fVar178;
        auVar232._4_4_ = fVar246 * fVar289;
        auVar232._8_4_ = fVar247 * fVar290;
        auVar232._12_4_ = fVar248 * fVar291;
        auVar232._16_4_ = fVar249 * fVar179;
        auVar232._20_4_ = fVar250 * fVar180;
        auVar232._24_4_ = fVar251 * fVar181;
        auVar232._28_4_ = 0;
        auVar12 = vsubps_avx(auVar232,ZEXT1632(auVar132));
        auVar210 = auVar12._0_28_;
        auVar61._4_4_ = fVar95 * (float)local_a80._4_4_;
        auVar61._0_4_ = fVar125 * (float)local_a80._0_4_;
        auVar61._8_4_ = fVar96 * fStack_a78;
        auVar61._12_4_ = fVar157 * fStack_a74;
        auVar61._16_4_ = fVar282 * fStack_a70;
        auVar61._20_4_ = fVar159 * fStack_a6c;
        auVar61._24_4_ = fVar283 * fStack_a68;
        auVar61._28_4_ = 0;
        _local_7a0 = vsubps_avx(auVar61,ZEXT1632(auVar206));
        auVar62._4_4_ = fVar95 * (float)local_900._4_4_;
        auVar62._0_4_ = fVar125 * (float)local_900._0_4_;
        auVar62._8_4_ = fVar96 * fStack_8f8;
        auVar62._12_4_ = fVar157 * fStack_8f4;
        auVar62._16_4_ = fVar282 * fStack_8f0;
        auVar62._20_4_ = fVar159 * fStack_8ec;
        auVar62._24_4_ = fVar283 * fStack_8e8;
        auVar62._28_4_ = local_7a0._28_4_;
        local_7c0 = vsubps_avx(auVar62,ZEXT1632(auVar3));
        auVar63._4_4_ = fVar246 * fVar95;
        auVar63._0_4_ = fVar240 * fVar125;
        auVar63._8_4_ = fVar247 * fVar96;
        auVar63._12_4_ = fVar248 * fVar157;
        auVar63._16_4_ = fVar249 * fVar282;
        auVar63._20_4_ = fVar250 * fVar159;
        auVar63._24_4_ = fVar251 * fVar283;
        auVar63._28_4_ = local_7c0._28_4_;
        _local_7e0 = vsubps_avx(auVar63,ZEXT1632(auVar4));
        auVar12 = vcmpps_avx(auVar10,_DAT_02020f00,5);
        auVar233._8_4_ = 0x7f800000;
        auVar233._0_8_ = 0x7f8000007f800000;
        auVar233._12_4_ = 0x7f800000;
        auVar233._16_4_ = 0x7f800000;
        auVar233._20_4_ = 0x7f800000;
        auVar233._24_4_ = 0x7f800000;
        auVar233._28_4_ = 0x7f800000;
        auVar231 = vblendvps_avx(auVar233,auVar57,auVar12);
        auVar10 = vandps_avx(local_780,auVar40);
        auVar10 = vmaxps_avx(local_420,auVar10);
        auVar64._4_4_ = auVar10._4_4_ * 1.9073486e-06;
        auVar64._0_4_ = auVar10._0_4_ * 1.9073486e-06;
        auVar64._8_4_ = auVar10._8_4_ * 1.9073486e-06;
        auVar64._12_4_ = auVar10._12_4_ * 1.9073486e-06;
        auVar64._16_4_ = auVar10._16_4_ * 1.9073486e-06;
        auVar64._20_4_ = auVar10._20_4_ * 1.9073486e-06;
        auVar64._24_4_ = auVar10._24_4_ * 1.9073486e-06;
        auVar64._28_4_ = auVar10._28_4_;
        auVar10 = vandps_avx(local_780,auVar11);
        auVar10 = vcmpps_avx(auVar10,auVar64,1);
        auVar239._8_4_ = 0xff800000;
        auVar239._0_8_ = 0xff800000ff800000;
        auVar239._12_4_ = 0xff800000;
        auVar239._16_4_ = 0xff800000;
        auVar239._20_4_ = 0xff800000;
        auVar239._24_4_ = 0xff800000;
        auVar239._28_4_ = 0xff800000;
        auVar238 = vblendvps_avx(auVar239,auVar58,auVar12);
        auVar11 = auVar12 & auVar10;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar10 = vandps_avx(auVar10,auVar12);
          auVar11 = vcmpps_avx(auVar108,ZEXT832(0) << 0x20,2);
          auVar273._8_4_ = 0xff800000;
          auVar273._0_8_ = 0xff800000ff800000;
          auVar273._12_4_ = 0xff800000;
          auVar273._16_4_ = 0xff800000;
          auVar273._20_4_ = 0xff800000;
          auVar273._24_4_ = 0xff800000;
          auVar273._28_4_ = 0xff800000;
          auVar276._8_4_ = 0x7f800000;
          auVar276._0_8_ = 0x7f8000007f800000;
          auVar276._12_4_ = 0x7f800000;
          auVar276._16_4_ = 0x7f800000;
          auVar276._20_4_ = 0x7f800000;
          auVar276._24_4_ = 0x7f800000;
          auVar276._28_4_ = 0x7f800000;
          auVar108 = vblendvps_avx(auVar276,auVar273,auVar11);
          auVar103 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          auVar174 = vpmovsxwd_avx2(auVar103);
          auVar231 = vblendvps_avx(auVar231,auVar108,auVar174);
          auVar108 = vblendvps_avx(auVar273,auVar276,auVar11);
          auVar266 = ZEXT3264(auVar108);
          auVar238 = vblendvps_avx(auVar238,auVar108,auVar174);
          auVar253._0_8_ = auVar10._0_8_ ^ 0xffffffffffffffff;
          auVar253._8_4_ = auVar10._8_4_ ^ 0xffffffff;
          auVar253._12_4_ = auVar10._12_4_ ^ 0xffffffff;
          auVar253._16_4_ = auVar10._16_4_ ^ 0xffffffff;
          auVar253._20_4_ = auVar10._20_4_ ^ 0xffffffff;
          auVar253._24_4_ = auVar10._24_4_ ^ 0xffffffff;
          auVar253._28_4_ = auVar10._28_4_ ^ 0xffffffff;
          auVar10 = vorps_avx(auVar11,auVar253);
          local_bc0 = vandps_avx(auVar10,auVar12);
        }
      }
      auVar281 = ZEXT3264(local_ae0);
      local_3c0 = _local_520;
      local_3a0 = vminps_avx(local_360,auVar231);
      _local_4c0 = vmaxps_avx(_local_520,auVar238);
      _local_380 = _local_4c0;
      auVar10 = vcmpps_avx(_local_520,local_3a0,2);
      local_480 = vandps_avx(auVar10,auVar117);
      auVar10 = vcmpps_avx(_local_4c0,local_360,2);
      local_560 = vandps_avx(auVar10,auVar117);
      auVar117 = vorps_avx(local_560,local_480);
      auVar241 = local_9c0._0_28_;
      auVar258 = ZEXT3264(local_a20);
      auVar261 = ZEXT3264(local_a40);
      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0x7f,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0xbf,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar117[0x1f]) {
        auVar254 = ZEXT3264(CONCAT824(uStack_988,
                                      CONCAT816(uStack_990,CONCAT88(uStack_998,local_9a0))));
      }
      else {
        local_500._0_8_ = local_bc0._0_8_ ^ 0xffffffffffffffff;
        local_500._8_4_ = local_bc0._8_4_ ^ 0xffffffff;
        local_500._12_4_ = local_bc0._12_4_ ^ 0xffffffff;
        local_500._16_4_ = local_bc0._16_4_ ^ 0xffffffff;
        local_500._20_4_ = local_bc0._20_4_ ^ 0xffffffff;
        local_500._24_4_ = local_bc0._24_4_ ^ 0xffffffff;
        local_500._28_4_ = local_bc0._28_4_ ^ 0xffffffff;
        auVar65._4_4_ = fVar246 * auVar210._4_4_;
        auVar65._0_4_ = fVar240 * auVar210._0_4_;
        auVar65._8_4_ = fVar247 * auVar210._8_4_;
        auVar65._12_4_ = fVar248 * auVar210._12_4_;
        auVar65._16_4_ = fVar249 * auVar210._16_4_;
        auVar65._20_4_ = fVar250 * auVar210._20_4_;
        auVar65._24_4_ = fVar251 * auVar210._24_4_;
        auVar65._28_4_ = local_bc0._28_4_;
        auVar103 = vfmadd213ps_fma(auVar201,_local_900,auVar65);
        auVar103 = vfmadd213ps_fma(auVar172,_local_a80,ZEXT1632(auVar103));
        auVar117 = vandps_avx(ZEXT1632(auVar103),local_780);
        auVar148._8_4_ = 0x3e99999a;
        auVar148._0_8_ = 0x3e99999a3e99999a;
        auVar148._12_4_ = 0x3e99999a;
        auVar148._16_4_ = 0x3e99999a;
        auVar148._20_4_ = 0x3e99999a;
        auVar148._24_4_ = 0x3e99999a;
        auVar148._28_4_ = 0x3e99999a;
        auVar117 = vcmpps_avx(auVar117,auVar148,1);
        auVar117 = vorps_avx(auVar117,local_500);
        auVar149._8_4_ = 3;
        auVar149._0_8_ = 0x300000003;
        auVar149._12_4_ = 3;
        auVar149._16_4_ = 3;
        auVar149._20_4_ = 3;
        auVar149._24_4_ = 3;
        auVar149._28_4_ = 3;
        auVar175._8_4_ = 2;
        auVar175._0_8_ = 0x200000002;
        auVar175._12_4_ = 2;
        auVar175._16_4_ = 2;
        auVar175._20_4_ = 2;
        auVar175._24_4_ = 2;
        auVar175._28_4_ = 2;
        auVar117 = vblendvps_avx(auVar175,auVar149,auVar117);
        uVar93 = (undefined4)local_5a0;
        local_5c0._4_4_ = uVar93;
        local_5c0._0_4_ = uVar93;
        local_5c0._8_4_ = uVar93;
        local_5c0._12_4_ = uVar93;
        local_5c0._16_4_ = uVar93;
        local_5c0._20_4_ = uVar93;
        local_5c0._24_4_ = uVar93;
        local_5c0._28_4_ = uVar93;
        local_4a0 = vpcmpgtd_avx2(auVar117,local_5c0);
        local_540 = vpandn_avx2(local_4a0,local_480);
        auVar215 = ZEXT3264(local_540);
        auVar117 = local_480 & ~local_4a0;
        auStack_598 = auVar168._8_24_;
        uVar89 = local_5a0;
        local_4e0 = local_560;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0x7f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0xbf,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar117[0x1f] < '\0') {
          auVar206 = vminps_avx(local_a90,local_ab0);
          auVar103 = vmaxps_avx(local_a90,local_ab0);
          auVar2 = vminps_avx(local_aa0,_local_ac0);
          auVar3 = vminps_avx(auVar206,auVar2);
          auVar206 = vmaxps_avx(local_aa0,_local_ac0);
          auVar2 = vmaxps_avx(auVar103,auVar206);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar103 = vandps_avx(auVar3,auVar182);
          local_920._0_16_ = auVar182;
          auVar206 = vandps_avx(auVar2,auVar182);
          auVar103 = vmaxps_avx(auVar103,auVar206);
          auVar206 = vmovshdup_avx(auVar103);
          auVar206 = vmaxss_avx(auVar206,auVar103);
          auVar103 = vshufpd_avx(auVar103,auVar103,1);
          auVar103 = vmaxss_avx(auVar103,auVar206);
          local_860._0_4_ = auVar103._0_4_ * 1.9073486e-06;
          local_720 = vshufps_avx(auVar2,auVar2,0xff);
          local_760._4_4_ = (float)local_520._4_4_ + (float)local_8c0._4_4_;
          local_760._0_4_ = (float)local_520._0_4_ + (float)local_8c0._0_4_;
          fStack_758 = fStack_518 + fStack_8b8;
          fStack_754 = fStack_514 + fStack_8b4;
          fStack_750 = fStack_510 + fStack_8b0;
          fStack_74c = fStack_50c + fStack_8ac;
          fStack_748 = fStack_508 + fStack_8a8;
          fStack_744 = fStack_504 + fStack_8a4;
          do {
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar117 = auVar215._0_32_;
            auVar10 = vblendvps_avx(auVar150,_local_520,auVar117);
            auVar108 = vshufps_avx(auVar10,auVar10,0xb1);
            auVar108 = vminps_avx(auVar10,auVar108);
            auVar11 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar11);
            auVar11 = vpermpd_avx2(auVar108,0x4e);
            auVar108 = vminps_avx(auVar108,auVar11);
            auVar10 = vcmpps_avx(auVar10,auVar108,0);
            auVar108 = auVar117 & auVar10;
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar108 >> 0x7f,0) != '\0') ||
                  (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0xbf,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar108[0x1f] < '\0') {
              auVar117 = vandps_avx(auVar10,auVar117);
            }
            local_740._0_8_ = uVar92;
            uVar88 = vmovmskps_avx(auVar117);
            iVar13 = 0;
            for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar86 = iVar13 << 2;
            *(undefined4 *)(local_540 + uVar86) = 0;
            uVar88 = *(uint *)(local_440 + uVar86);
            fVar125 = *(float *)(local_3c0 + uVar86);
            fVar95 = local_b04;
            if ((float)local_940._0_4_ < 0.0) {
              fVar95 = sqrtf((float)local_940._0_4_);
            }
            auVar215 = ZEXT464(uVar88);
            local_8a0._0_4_ = fVar95 * 1.9073486e-06;
            lVar90 = 5;
            do {
              fVar156 = auVar215._0_4_;
              fVar95 = 1.0 - fVar156;
              auVar126._0_4_ = local_ab0._0_4_ * fVar156;
              auVar126._4_4_ = local_ab0._4_4_ * fVar156;
              auVar126._8_4_ = local_ab0._8_4_ * fVar156;
              auVar126._12_4_ = local_ab0._12_4_ * fVar156;
              auVar162._4_4_ = fVar95;
              auVar162._0_4_ = fVar95;
              auVar162._8_4_ = fVar95;
              auVar162._12_4_ = fVar95;
              auVar103 = vfmadd231ps_fma(auVar126,auVar162,local_a90);
              auVar183._0_4_ = local_aa0._0_4_ * fVar156;
              auVar183._4_4_ = local_aa0._4_4_ * fVar156;
              auVar183._8_4_ = local_aa0._8_4_ * fVar156;
              auVar183._12_4_ = local_aa0._12_4_ * fVar156;
              auVar206 = vfmadd231ps_fma(auVar183,auVar162,local_ab0);
              auVar223._0_4_ = fVar156 * auVar206._0_4_;
              auVar223._4_4_ = fVar156 * auVar206._4_4_;
              auVar223._8_4_ = fVar156 * auVar206._8_4_;
              auVar223._12_4_ = fVar156 * auVar206._12_4_;
              local_a60._0_16_ = vfmadd231ps_fma(auVar223,auVar162,auVar103);
              auVar127._0_4_ = fVar156 * (float)local_ac0._0_4_;
              auVar127._4_4_ = fVar156 * (float)local_ac0._4_4_;
              auVar127._8_4_ = fVar156 * fStack_ab8;
              auVar127._12_4_ = fVar156 * fStack_ab4;
              auVar103 = vfmadd231ps_fma(auVar127,auVar162,local_aa0);
              auVar205._0_4_ = fVar156 * auVar103._0_4_;
              auVar205._4_4_ = fVar156 * auVar103._4_4_;
              auVar205._8_4_ = fVar156 * auVar103._8_4_;
              auVar205._12_4_ = fVar156 * auVar103._12_4_;
              auVar206 = vfmadd231ps_fma(auVar205,auVar162,auVar206);
              auVar128._4_4_ = fVar125;
              auVar128._0_4_ = fVar125;
              auVar128._8_4_ = fVar125;
              auVar128._12_4_ = fVar125;
              auVar103 = vfmadd213ps_fma(auVar128,local_930,_DAT_01feba10);
              auVar99._0_4_ = fVar156 * auVar206._0_4_;
              auVar99._4_4_ = fVar156 * auVar206._4_4_;
              auVar99._8_4_ = fVar156 * auVar206._8_4_;
              auVar99._12_4_ = fVar156 * auVar206._12_4_;
              auVar2 = vfmadd231ps_fma(auVar99,local_a60._0_16_,auVar162);
              local_6a0._0_16_ = auVar2;
              auVar103 = vsubps_avx(auVar103,auVar2);
              _local_880 = auVar103;
              auVar103 = vdpps_avx(auVar103,auVar103,0x7f);
              local_840._0_16_ = auVar103;
              if (auVar103._0_4_ < 0.0) {
                local_b00._0_16_ = auVar206;
                auVar122._0_4_ = sqrtf(auVar103._0_4_);
                auVar122._4_60_ = extraout_var;
                auVar103 = auVar122._0_16_;
                auVar206 = local_b00._0_16_;
              }
              else {
                auVar103 = vsqrtss_avx(auVar103,auVar103);
              }
              auVar206 = vsubps_avx(auVar206,local_a60._0_16_);
              local_a60._0_4_ = auVar206._0_4_ * 3.0;
              local_a60._4_4_ = auVar206._4_4_ * 3.0;
              local_a60._8_4_ = auVar206._8_4_ * 3.0;
              local_a60._12_4_ = auVar206._12_4_ * 3.0;
              auVar206 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar95),
                                         auVar215._0_16_);
              auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar215._0_16_,
                                       ZEXT416((uint)fVar95));
              fVar95 = fVar95 * 6.0;
              fVar96 = auVar206._0_4_ * 6.0;
              fVar161 = auVar2._0_4_ * 6.0;
              fVar157 = fVar156 * 6.0;
              auVar184._0_4_ = fVar157 * (float)local_ac0._0_4_;
              auVar184._4_4_ = fVar157 * (float)local_ac0._4_4_;
              auVar184._8_4_ = fVar157 * fStack_ab8;
              auVar184._12_4_ = fVar157 * fStack_ab4;
              auVar129._4_4_ = fVar161;
              auVar129._0_4_ = fVar161;
              auVar129._8_4_ = fVar161;
              auVar129._12_4_ = fVar161;
              auVar206 = vfmadd132ps_fma(auVar129,auVar184,local_aa0);
              auVar185._4_4_ = fVar96;
              auVar185._0_4_ = fVar96;
              auVar185._8_4_ = fVar96;
              auVar185._12_4_ = fVar96;
              auVar206 = vfmadd132ps_fma(auVar185,auVar206,local_ab0);
              auVar2 = vdpps_avx(local_a60._0_16_,local_a60._0_16_,0x7f);
              auVar130._4_4_ = fVar95;
              auVar130._0_4_ = fVar95;
              auVar130._8_4_ = fVar95;
              auVar130._12_4_ = fVar95;
              auVar132 = vfmadd132ps_fma(auVar130,auVar206,local_a90);
              auVar206 = vblendps_avx(auVar2,_DAT_01feba10,0xe);
              auVar3 = vrsqrtss_avx(auVar206,auVar206);
              fVar161 = auVar2._0_4_;
              fVar95 = auVar3._0_4_;
              auVar3 = vdpps_avx(local_a60._0_16_,auVar132,0x7f);
              fVar95 = fVar95 * 1.5 + fVar161 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar131._0_4_ = auVar132._0_4_ * fVar161;
              auVar131._4_4_ = auVar132._4_4_ * fVar161;
              auVar131._8_4_ = auVar132._8_4_ * fVar161;
              auVar131._12_4_ = auVar132._12_4_ * fVar161;
              fVar96 = auVar3._0_4_;
              auVar224._0_4_ = local_a60._0_4_ * fVar96;
              auVar224._4_4_ = local_a60._4_4_ * fVar96;
              auVar224._8_4_ = local_a60._8_4_ * fVar96;
              auVar224._12_4_ = local_a60._12_4_ * fVar96;
              auVar3 = vsubps_avx(auVar131,auVar224);
              auVar206 = vrcpss_avx(auVar206,auVar206);
              auVar132 = vfnmadd213ss_fma(auVar206,auVar2,ZEXT416(0x40000000));
              fVar96 = auVar206._0_4_ * auVar132._0_4_;
              auVar206 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                    ZEXT416((uint)(fVar125 * (float)local_8a0._0_4_)));
              uVar92 = CONCAT44(local_a60._4_4_,local_a60._0_4_);
              auVar255._0_8_ = uVar92 ^ 0x8000000080000000;
              auVar255._8_4_ = -local_a60._8_4_;
              auVar255._12_4_ = -local_a60._12_4_;
              auVar186._0_4_ = fVar95 * auVar3._0_4_ * fVar96;
              auVar186._4_4_ = fVar95 * auVar3._4_4_ * fVar96;
              auVar186._8_4_ = fVar95 * auVar3._8_4_ * fVar96;
              auVar186._12_4_ = fVar95 * auVar3._12_4_ * fVar96;
              local_980._0_4_ = local_a60._0_4_ * fVar95;
              local_980._4_4_ = local_a60._4_4_ * fVar95;
              local_980._8_4_ = local_a60._8_4_ * fVar95;
              local_980._12_4_ = local_a60._12_4_ * fVar95;
              if (fVar161 < -fVar161) {
                local_b00._0_4_ = auVar103._0_4_;
                local_960._0_16_ = auVar255;
                local_8e0._0_16_ = auVar186;
                fVar95 = sqrtf(fVar161);
                auVar103 = ZEXT416((uint)local_b00._0_4_);
                auVar186 = local_8e0._0_16_;
                auVar255 = local_960._0_16_;
              }
              else {
                auVar2 = vsqrtss_avx(auVar2,auVar2);
                fVar95 = auVar2._0_4_;
              }
              local_b00._0_16_ = vdpps_avx(_local_880,local_980._0_16_,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar103,
                                       ZEXT416((uint)auVar206._0_4_));
              auVar2 = vdpps_avx(auVar255,local_980._0_16_,0x7f);
              auVar3 = vdpps_avx(_local_880,auVar186,0x7f);
              auVar132 = vdpps_avx(local_930,local_980._0_16_,0x7f);
              auVar103 = vfmadd213ss_fma(ZEXT416((uint)(auVar103._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_860._0_4_ / fVar95)),auVar4);
              local_960._0_4_ = auVar103._0_4_;
              auVar100._0_4_ = local_b00._0_4_ * local_b00._0_4_;
              auVar100._4_4_ = local_b00._4_4_ * local_b00._4_4_;
              auVar100._8_4_ = local_b00._8_4_ * local_b00._8_4_;
              auVar100._12_4_ = local_b00._12_4_ * local_b00._12_4_;
              auVar103 = vdpps_avx(_local_880,auVar255,0x7f);
              auVar142 = vsubps_avx(local_840._0_16_,auVar100);
              auVar4 = vrsqrtss_avx(auVar142,auVar142);
              fVar96 = auVar142._0_4_;
              fVar95 = auVar4._0_4_;
              fVar95 = fVar95 * 1.5 + fVar96 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar4 = vdpps_avx(_local_880,local_930,0x7f);
              local_980._0_16_ = ZEXT416((uint)(auVar2._0_4_ + auVar3._0_4_));
              auVar103 = vfnmadd231ss_fma(auVar103,local_b00._0_16_,local_980._0_16_);
              auVar2 = vfnmadd231ss_fma(auVar4,local_b00._0_16_,auVar132);
              if (fVar96 < 0.0) {
                local_8e0._0_16_ = auVar132;
                local_6c0._0_16_ = auVar103;
                local_6e0._0_4_ = fVar95;
                local_700._0_16_ = auVar2;
                fVar96 = sqrtf(fVar96);
                fVar95 = (float)local_6e0._0_4_;
                auVar2 = local_700._0_16_;
                auVar132 = local_8e0._0_16_;
                auVar103 = local_6c0._0_16_;
              }
              else {
                auVar3 = vsqrtss_avx(auVar142,auVar142);
                fVar96 = auVar3._0_4_;
              }
              auVar266 = ZEXT3264(local_a40);
              auVar3 = vpermilps_avx(local_6a0._0_16_,0xff);
              auVar4 = vpermilps_avx(local_a60._0_16_,0xff);
              auVar103 = vfmsub213ss_fma(auVar103,ZEXT416((uint)fVar95),auVar4);
              auVar187._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
              auVar187._8_4_ = auVar132._8_4_ ^ 0x80000000;
              auVar187._12_4_ = auVar132._12_4_ ^ 0x80000000;
              auVar207._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar207._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar207._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar142 = ZEXT416((uint)(auVar2._0_4_ * fVar95));
              auVar2 = vfmsub231ss_fma(ZEXT416((uint)(auVar132._0_4_ * auVar103._0_4_)),
                                       local_980._0_16_,auVar142);
              auVar103 = vinsertps_avx(auVar142,auVar187,0x10);
              uVar93 = auVar2._0_4_;
              auVar188._4_4_ = uVar93;
              auVar188._0_4_ = uVar93;
              auVar188._8_4_ = uVar93;
              auVar188._12_4_ = uVar93;
              auVar103 = vdivps_avx(auVar103,auVar188);
              auVar132 = ZEXT416((uint)(fVar96 - auVar3._0_4_));
              auVar3 = vinsertps_avx(local_b00._0_16_,auVar132,0x10);
              auVar163._0_4_ = auVar3._0_4_ * auVar103._0_4_;
              auVar163._4_4_ = auVar3._4_4_ * auVar103._4_4_;
              auVar163._8_4_ = auVar3._8_4_ * auVar103._8_4_;
              auVar163._12_4_ = auVar3._12_4_ * auVar103._12_4_;
              auVar103 = vinsertps_avx(auVar207,local_980._0_16_,0x1c);
              auVar103 = vdivps_avx(auVar103,auVar188);
              auVar2 = vhaddps_avx(auVar163,auVar163);
              auVar189._0_4_ = auVar3._0_4_ * auVar103._0_4_;
              auVar189._4_4_ = auVar3._4_4_ * auVar103._4_4_;
              auVar189._8_4_ = auVar3._8_4_ * auVar103._8_4_;
              auVar189._12_4_ = auVar3._12_4_ * auVar103._12_4_;
              auVar103 = vhaddps_avx(auVar189,auVar189);
              fVar156 = fVar156 - auVar2._0_4_;
              auVar215 = ZEXT464((uint)fVar156);
              fVar125 = fVar125 - auVar103._0_4_;
              auVar103 = vandps_avx(local_b00._0_16_,local_920._0_16_);
              bVar51 = true;
              auVar241 = local_9c0._0_28_;
              if ((float)local_960._0_4_ <= auVar103._0_4_) {
LAB_0181a65f:
                auVar281 = ZEXT3264(local_ae0);
                auVar258 = ZEXT3264(local_a20);
                auVar261 = ZEXT3264(local_a40);
              }
              else {
                auVar206 = vfmadd231ss_fma(ZEXT416((uint)((float)local_960._0_4_ + auVar206._0_4_)),
                                           local_720,ZEXT416(0x36000000));
                auVar103 = vandps_avx(auVar132,local_920._0_16_);
                if (auVar206._0_4_ <= auVar103._0_4_) goto LAB_0181a65f;
                fVar125 = fVar125 + (float)local_820._0_4_;
                auVar281 = ZEXT3264(local_ae0);
                if ((fVar125 < fVar94) ||
                   (fVar95 = *(float *)(ray + k * 4 + 0x80), fVar95 < fVar125)) {
                  bVar51 = false;
                  unaff_BL = 0;
                  goto LAB_0181a65f;
                }
                bVar51 = false;
                if (fVar156 < 0.0) {
                  unaff_BL = 0;
                  goto LAB_0181a65f;
                }
                auVar258 = ZEXT3264(local_a20);
                if (1.0 < fVar156) {
                  unaff_BL = 0;
                  bVar51 = false;
                  goto LAB_0181a65f;
                }
                auVar103 = vrsqrtss_avx(local_840._0_16_,local_840._0_16_);
                fVar96 = auVar103._0_4_;
                pGVar8 = (context->scene->geometries).items[local_9f8].ptr;
                auVar261 = ZEXT3264(local_a40);
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  unaff_BL = 0;
LAB_0181a712:
                  bVar51 = false;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    unaff_BL = 1;
                    goto LAB_0181a712;
                  }
                  fVar96 = fVar96 * 1.5 + local_840._0_4_ * -0.5 * fVar96 * fVar96 * fVar96;
                  auVar133._0_4_ = fVar96 * (float)local_880._0_4_;
                  auVar133._4_4_ = fVar96 * (float)local_880._4_4_;
                  auVar133._8_4_ = fVar96 * fStack_878;
                  auVar133._12_4_ = fVar96 * fStack_874;
                  auVar3 = vfmadd213ps_fma(auVar4,auVar133,local_a60._0_16_);
                  auVar103 = vshufps_avx(auVar133,auVar133,0xc9);
                  auVar206 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                  auVar134._0_4_ = auVar133._0_4_ * auVar206._0_4_;
                  auVar134._4_4_ = auVar133._4_4_ * auVar206._4_4_;
                  auVar134._8_4_ = auVar133._8_4_ * auVar206._8_4_;
                  auVar134._12_4_ = auVar133._12_4_ * auVar206._12_4_;
                  auVar2 = vfmsub231ps_fma(auVar134,local_a60._0_16_,auVar103);
                  auVar103 = vshufps_avx(auVar2,auVar2,0xc9);
                  auVar206 = vshufps_avx(auVar3,auVar3,0xc9);
                  auVar2 = vshufps_avx(auVar2,auVar2,0xd2);
                  auVar101._0_4_ = auVar3._0_4_ * auVar2._0_4_;
                  auVar101._4_4_ = auVar3._4_4_ * auVar2._4_4_;
                  auVar101._8_4_ = auVar3._8_4_ * auVar2._8_4_;
                  auVar101._12_4_ = auVar3._12_4_ * auVar2._12_4_;
                  auVar103 = vfmsub231ps_fma(auVar101,auVar103,auVar206);
                  local_660 = (RTCHitN  [16])vshufps_avx(auVar103,auVar103,0x55);
                  auStack_650 = vshufps_avx(auVar103,auVar103,0xaa);
                  local_640 = auVar103._0_4_;
                  local_620 = ZEXT416(0) << 0x20;
                  local_610 = CONCAT44(uStack_67c,local_680);
                  uStack_608 = CONCAT44(uStack_674,uStack_678);
                  local_600._4_4_ = uStack_66c;
                  local_600._0_4_ = local_670;
                  local_600._8_4_ = uStack_668;
                  local_600._12_4_ = uStack_664;
                  vpcmpeqd_avx2(ZEXT1632(local_600),ZEXT1632(local_600));
                  uStack_5ec = context->user->instID[0];
                  local_5f0 = uStack_5ec;
                  uStack_5e8 = uStack_5ec;
                  uStack_5e4 = uStack_5ec;
                  uStack_5e0 = context->user->instPrimID[0];
                  uStack_5dc = uStack_5e0;
                  uStack_5d8 = uStack_5e0;
                  uStack_5d4 = uStack_5e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar125;
                  local_b20 = *local_a00;
                  uStack_b18 = local_a00[1];
                  local_9f0.valid = (int *)&local_b20;
                  local_9f0.geometryUserPtr = pGVar8->userPtr;
                  local_9f0.context = context->user;
                  local_9f0.hit = local_660;
                  local_9f0.N = 4;
                  local_9f0.ray = (RTCRayN *)ray;
                  uStack_63c = local_640;
                  uStack_638 = local_640;
                  uStack_634 = local_640;
                  local_630 = fVar156;
                  fStack_62c = fVar156;
                  fStack_628 = fVar156;
                  fStack_624 = fVar156;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar266 = ZEXT1664(local_a40._0_16_);
                    (*pGVar8->occlusionFilterN)(&local_9f0);
                    auVar215 = ZEXT1664(ZEXT416((uint)fVar156));
                    auVar281 = ZEXT3264(local_ae0);
                    auVar261 = ZEXT3264(local_a40);
                    auVar258 = ZEXT3264(local_a20);
                  }
                  auVar241 = local_9c0._0_28_;
                  auVar75._8_8_ = uStack_b18;
                  auVar75._0_8_ = local_b20;
                  if (auVar75 == (undefined1  [16])0x0) {
                    auVar103 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar103 = auVar103 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar266 = ZEXT1664(auVar266._0_16_);
                      (*p_Var9)(&local_9f0);
                      auVar215 = ZEXT1664(ZEXT416((uint)fVar156));
                      auVar281 = ZEXT3264(local_ae0);
                      auVar261 = ZEXT3264(local_a40);
                      auVar258 = ZEXT3264(local_a20);
                      auVar241 = local_9c0._0_28_;
                    }
                    auVar76._8_8_ = uStack_b18;
                    auVar76._0_8_ = local_b20;
                    auVar206 = vpcmpeqd_avx((undefined1  [16])0x0,auVar76);
                    auVar103 = auVar206 ^ _DAT_01febe20;
                    auVar164._8_4_ = 0xff800000;
                    auVar164._0_8_ = 0xff800000ff800000;
                    auVar164._12_4_ = 0xff800000;
                    auVar206 = vblendvps_avx(auVar164,*(undefined1 (*) [16])(local_9f0.ray + 0x80),
                                             auVar206);
                    *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar206;
                  }
                  auVar135._8_8_ = 0x100000001;
                  auVar135._0_8_ = 0x100000001;
                  unaff_BL = (auVar135 & auVar103) != (undefined1  [16])0x0;
                  if (!(bool)unaff_BL) {
                    *(float *)(ray + k * 4 + 0x80) = fVar95;
                  }
                  bVar51 = false;
                }
              }
              if (!bVar51) goto LAB_0181a9fe;
              lVar90 = lVar90 + -1;
            } while (lVar90 != 0);
            unaff_BL = 0;
LAB_0181a9fe:
            unaff_BL = unaff_BL & 1;
            uVar92 = CONCAT71(local_740._1_7_,local_740[0] | unaff_BL);
            uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar118._4_4_ = uVar93;
            auVar118._0_4_ = uVar93;
            auVar118._8_4_ = uVar93;
            auVar118._12_4_ = uVar93;
            auVar118._16_4_ = uVar93;
            auVar118._20_4_ = uVar93;
            auVar118._24_4_ = uVar93;
            auVar118._28_4_ = uVar93;
            auVar10 = vcmpps_avx(_local_760,auVar118,2);
            auVar117 = vandps_avx(auVar10,local_540);
            auVar215 = ZEXT3264(auVar117);
            auVar10 = local_540 & auVar10;
            uVar89 = local_5a0;
            local_540 = auVar117;
          } while ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar10 >> 0x7f,0) != '\0') ||
                     (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar10 >> 0xbf,0) != '\0') ||
                   (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar10[0x1f] < '\0');
        }
        auVar123._0_4_ = auVar241._0_4_ * (float)local_7e0._0_4_;
        auVar123._4_4_ = auVar241._4_4_ * (float)local_7e0._4_4_;
        auVar123._8_4_ = auVar241._8_4_ * fStack_7d8;
        auVar123._12_4_ = auVar241._12_4_ * fStack_7d4;
        auVar123._16_4_ = auVar241._16_4_ * fStack_7d0;
        auVar123._20_4_ = auVar241._20_4_ * fStack_7cc;
        auVar123._28_36_ = auVar215._28_36_;
        auVar123._24_4_ = auVar241._24_4_ * fStack_7c8;
        auVar103 = vfmadd213ps_fma(local_7c0,_local_900,auVar123._0_32_);
        auVar103 = vfmadd213ps_fma(_local_7a0,_local_a80,ZEXT1632(auVar103));
        auVar117 = vandps_avx(ZEXT1632(auVar103),local_780);
        auVar151._8_4_ = 0x3e99999a;
        auVar151._0_8_ = 0x3e99999a3e99999a;
        auVar151._12_4_ = 0x3e99999a;
        auVar151._16_4_ = 0x3e99999a;
        auVar151._20_4_ = 0x3e99999a;
        auVar151._24_4_ = 0x3e99999a;
        auVar151._28_4_ = 0x3e99999a;
        auVar117 = vcmpps_avx(auVar117,auVar151,1);
        auVar10 = vorps_avx(auVar117,local_500);
        auVar152._0_4_ = (float)local_8c0._0_4_ + (float)local_4c0._0_4_;
        auVar152._4_4_ = (float)local_8c0._4_4_ + (float)local_4c0._4_4_;
        auVar152._8_4_ = fStack_8b8 + fStack_4b8;
        auVar152._12_4_ = fStack_8b4 + fStack_4b4;
        auVar152._16_4_ = fStack_8b0 + fStack_4b0;
        auVar152._20_4_ = fStack_8ac + fStack_4ac;
        auVar152._24_4_ = fStack_8a8 + fStack_4a8;
        auVar152._28_4_ = fStack_8a4 + fStack_4a4;
        uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar176._4_4_ = uVar93;
        auVar176._0_4_ = uVar93;
        auVar176._8_4_ = uVar93;
        auVar176._12_4_ = uVar93;
        auVar176._16_4_ = uVar93;
        auVar176._20_4_ = uVar93;
        auVar176._24_4_ = uVar93;
        auVar176._28_4_ = uVar93;
        auVar117 = vcmpps_avx(auVar152,auVar176,2);
        local_7c0 = vandps_avx(auVar117,local_4e0);
        auVar153._8_4_ = 3;
        auVar153._0_8_ = 0x300000003;
        auVar153._12_4_ = 3;
        auVar153._16_4_ = 3;
        auVar153._20_4_ = 3;
        auVar153._24_4_ = 3;
        auVar153._28_4_ = 3;
        auVar177._8_4_ = 2;
        auVar177._0_8_ = 0x200000002;
        auVar177._12_4_ = 2;
        auVar177._16_4_ = 2;
        auVar177._20_4_ = 2;
        auVar177._24_4_ = 2;
        auVar177._28_4_ = 2;
        auVar117 = vblendvps_avx(auVar177,auVar153,auVar10);
        _local_7e0 = vpcmpgtd_avx2(auVar117,local_5c0);
        auVar117 = vpandn_avx2(_local_7e0,local_7c0);
        auVar10 = local_7c0 & ~_local_7e0;
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0x7f,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar10 >> 0xbf,0) == '\0') &&
            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar10[0x1f]) {
          auVar254 = ZEXT3264(CONCAT824(uStack_988,
                                        CONCAT816(uStack_990,CONCAT88(uStack_998,local_9a0))));
          local_5a0 = uVar89;
        }
        else {
          auVar206 = vminps_avx(local_a90,local_ab0);
          auVar103 = vmaxps_avx(local_a90,local_ab0);
          auVar2 = vminps_avx(local_aa0,_local_ac0);
          auVar3 = vminps_avx(auVar206,auVar2);
          auVar206 = vmaxps_avx(local_aa0,_local_ac0);
          auVar2 = vmaxps_avx(auVar103,auVar206);
          local_8e0._8_4_ = 0x7fffffff;
          local_8e0._0_8_ = 0x7fffffff7fffffff;
          local_8e0._12_4_ = 0x7fffffff;
          auVar103 = vandps_avx(auVar3,local_8e0._0_16_);
          auVar206 = vandps_avx(auVar2,local_8e0._0_16_);
          auVar103 = vmaxps_avx(auVar103,auVar206);
          auVar206 = vmovshdup_avx(auVar103);
          auVar206 = vmaxss_avx(auVar206,auVar103);
          auVar103 = vshufpd_avx(auVar103,auVar103,1);
          auVar103 = vmaxss_avx(auVar103,auVar206);
          local_860._0_4_ = auVar103._0_4_ * 1.9073486e-06;
          local_720 = vshufps_avx(auVar2,auVar2,0xff);
          _local_760 = _local_380;
          local_7a0._4_4_ = (float)local_8c0._4_4_ + (float)local_380._4_4_;
          local_7a0._0_4_ = (float)local_8c0._0_4_ + (float)local_380._0_4_;
          fStack_798 = fStack_8b8 + fStack_378;
          fStack_794 = fStack_8b4 + fStack_374;
          fStack_790 = fStack_8b0 + fStack_370;
          fStack_78c = fStack_8ac + fStack_36c;
          fStack_788 = fStack_8a8 + fStack_368;
          fStack_784 = fStack_8a4 + fStack_364;
          do {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar154,_local_760,auVar117);
            auVar108 = vshufps_avx(auVar10,auVar10,0xb1);
            auVar108 = vminps_avx(auVar10,auVar108);
            auVar11 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar11);
            auVar11 = vpermpd_avx2(auVar108,0x4e);
            auVar108 = vminps_avx(auVar108,auVar11);
            auVar108 = vcmpps_avx(auVar10,auVar108,0);
            auVar11 = auVar117 & auVar108;
            auVar10 = auVar117;
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0x7f,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0x1f] < '\0') {
              auVar10 = vandps_avx(auVar108,auVar117);
            }
            local_740._0_8_ = uVar92;
            uVar88 = vmovmskps_avx(auVar10);
            iVar13 = 0;
            for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar86 = iVar13 << 2;
            local_560 = auVar117;
            *(undefined4 *)(local_560 + uVar86) = 0;
            uVar88 = *(uint *)(local_460 + uVar86);
            fVar125 = *(float *)(local_360 + uVar86);
            fVar95 = local_b08;
            if ((float)local_940._0_4_ < 0.0) {
              auVar266 = ZEXT1664(auVar266._0_16_);
              fVar95 = sqrtf((float)local_940._0_4_);
            }
            auVar215 = ZEXT464(uVar88);
            local_920._0_4_ = fVar95 * 1.9073486e-06;
            lVar90 = 5;
            do {
              fVar156 = auVar215._0_4_;
              fVar95 = 1.0 - fVar156;
              auVar136._0_4_ = local_ab0._0_4_ * fVar156;
              auVar136._4_4_ = local_ab0._4_4_ * fVar156;
              auVar136._8_4_ = local_ab0._8_4_ * fVar156;
              auVar136._12_4_ = local_ab0._12_4_ * fVar156;
              auVar165._4_4_ = fVar95;
              auVar165._0_4_ = fVar95;
              auVar165._8_4_ = fVar95;
              auVar165._12_4_ = fVar95;
              auVar103 = vfmadd231ps_fma(auVar136,auVar165,local_a90);
              auVar190._0_4_ = local_aa0._0_4_ * fVar156;
              auVar190._4_4_ = local_aa0._4_4_ * fVar156;
              auVar190._8_4_ = local_aa0._8_4_ * fVar156;
              auVar190._12_4_ = local_aa0._12_4_ * fVar156;
              auVar206 = vfmadd231ps_fma(auVar190,auVar165,local_ab0);
              auVar225._0_4_ = fVar156 * auVar206._0_4_;
              auVar225._4_4_ = fVar156 * auVar206._4_4_;
              auVar225._8_4_ = fVar156 * auVar206._8_4_;
              auVar225._12_4_ = fVar156 * auVar206._12_4_;
              local_a60._0_16_ = vfmadd231ps_fma(auVar225,auVar165,auVar103);
              auVar137._0_4_ = fVar156 * (float)local_ac0._0_4_;
              auVar137._4_4_ = fVar156 * (float)local_ac0._4_4_;
              auVar137._8_4_ = fVar156 * fStack_ab8;
              auVar137._12_4_ = fVar156 * fStack_ab4;
              auVar103 = vfmadd231ps_fma(auVar137,auVar165,local_aa0);
              auVar208._0_4_ = fVar156 * auVar103._0_4_;
              auVar208._4_4_ = fVar156 * auVar103._4_4_;
              auVar208._8_4_ = fVar156 * auVar103._8_4_;
              auVar208._12_4_ = fVar156 * auVar103._12_4_;
              auVar206 = vfmadd231ps_fma(auVar208,auVar165,auVar206);
              auVar138._4_4_ = fVar125;
              auVar138._0_4_ = fVar125;
              auVar138._8_4_ = fVar125;
              auVar138._12_4_ = fVar125;
              auVar103 = vfmadd213ps_fma(auVar138,local_930,_DAT_01feba10);
              auVar102._0_4_ = fVar156 * auVar206._0_4_;
              auVar102._4_4_ = fVar156 * auVar206._4_4_;
              auVar102._8_4_ = fVar156 * auVar206._8_4_;
              auVar102._12_4_ = fVar156 * auVar206._12_4_;
              auVar2 = vfmadd231ps_fma(auVar102,local_a60._0_16_,auVar165);
              local_6a0._0_16_ = auVar2;
              auVar103 = vsubps_avx(auVar103,auVar2);
              _local_880 = auVar103;
              auVar103 = vdpps_avx(auVar103,auVar103,0x7f);
              local_840._0_16_ = auVar103;
              if (auVar103._0_4_ < 0.0) {
                local_b00._0_16_ = auVar206;
                auVar266 = ZEXT1664(auVar266._0_16_);
                auVar124._0_4_ = sqrtf(auVar103._0_4_);
                auVar124._4_60_ = extraout_var_00;
                auVar103 = auVar124._0_16_;
                auVar206 = local_b00._0_16_;
              }
              else {
                auVar103 = vsqrtss_avx(auVar103,auVar103);
              }
              auVar206 = vsubps_avx(auVar206,local_a60._0_16_);
              local_a60._0_4_ = auVar206._0_4_ * 3.0;
              local_a60._4_4_ = auVar206._4_4_ * 3.0;
              local_a60._8_4_ = auVar206._8_4_ * 3.0;
              local_a60._12_4_ = auVar206._12_4_ * 3.0;
              auVar206 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar95),
                                         auVar215._0_16_);
              auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar215._0_16_,
                                       ZEXT416((uint)fVar95));
              fVar95 = fVar95 * 6.0;
              fVar96 = auVar206._0_4_ * 6.0;
              fVar161 = auVar2._0_4_ * 6.0;
              fVar157 = fVar156 * 6.0;
              auVar191._0_4_ = fVar157 * (float)local_ac0._0_4_;
              auVar191._4_4_ = fVar157 * (float)local_ac0._4_4_;
              auVar191._8_4_ = fVar157 * fStack_ab8;
              auVar191._12_4_ = fVar157 * fStack_ab4;
              auVar139._4_4_ = fVar161;
              auVar139._0_4_ = fVar161;
              auVar139._8_4_ = fVar161;
              auVar139._12_4_ = fVar161;
              auVar206 = vfmadd132ps_fma(auVar139,auVar191,local_aa0);
              auVar192._4_4_ = fVar96;
              auVar192._0_4_ = fVar96;
              auVar192._8_4_ = fVar96;
              auVar192._12_4_ = fVar96;
              auVar206 = vfmadd132ps_fma(auVar192,auVar206,local_ab0);
              auVar2 = vdpps_avx(local_a60._0_16_,local_a60._0_16_,0x7f);
              auVar140._4_4_ = fVar95;
              auVar140._0_4_ = fVar95;
              auVar140._8_4_ = fVar95;
              auVar140._12_4_ = fVar95;
              auVar132 = vfmadd132ps_fma(auVar140,auVar206,local_a90);
              auVar206 = vblendps_avx(auVar2,_DAT_01feba10,0xe);
              auVar3 = vrsqrtss_avx(auVar206,auVar206);
              fVar161 = auVar2._0_4_;
              fVar95 = auVar3._0_4_;
              auVar3 = vdpps_avx(local_a60._0_16_,auVar132,0x7f);
              fVar95 = fVar95 * 1.5 + fVar161 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar141._0_4_ = auVar132._0_4_ * fVar161;
              auVar141._4_4_ = auVar132._4_4_ * fVar161;
              auVar141._8_4_ = auVar132._8_4_ * fVar161;
              auVar141._12_4_ = auVar132._12_4_ * fVar161;
              fVar96 = auVar3._0_4_;
              auVar226._0_4_ = local_a60._0_4_ * fVar96;
              auVar226._4_4_ = local_a60._4_4_ * fVar96;
              auVar226._8_4_ = local_a60._8_4_ * fVar96;
              auVar226._12_4_ = local_a60._12_4_ * fVar96;
              auVar3 = vsubps_avx(auVar141,auVar226);
              auVar206 = vrcpss_avx(auVar206,auVar206);
              auVar132 = vfnmadd213ss_fma(auVar206,auVar2,ZEXT416(0x40000000));
              fVar96 = auVar206._0_4_ * auVar132._0_4_;
              auVar206 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                    ZEXT416((uint)(fVar125 * (float)local_920._0_4_)));
              uVar92 = CONCAT44(local_a60._4_4_,local_a60._0_4_);
              local_960._0_8_ = uVar92 ^ 0x8000000080000000;
              local_960._8_4_ = -local_a60._8_4_;
              local_960._12_4_ = -local_a60._12_4_;
              local_8a0._0_4_ = fVar95 * auVar3._0_4_ * fVar96;
              local_8a0._4_4_ = fVar95 * auVar3._4_4_ * fVar96;
              local_8a0._8_4_ = fVar95 * auVar3._8_4_ * fVar96;
              local_8a0._12_4_ = fVar95 * auVar3._12_4_ * fVar96;
              local_980._0_4_ = local_a60._0_4_ * fVar95;
              local_980._4_4_ = local_a60._4_4_ * fVar95;
              local_980._8_4_ = local_a60._8_4_ * fVar95;
              local_980._12_4_ = local_a60._12_4_ * fVar95;
              if (fVar161 < -fVar161) {
                local_b00._0_4_ = auVar103._0_4_;
                auVar266 = ZEXT1664(auVar266._0_16_);
                fVar95 = sqrtf(fVar161);
                auVar103 = ZEXT416((uint)local_b00._0_4_);
              }
              else {
                auVar2 = vsqrtss_avx(auVar2,auVar2);
                fVar95 = auVar2._0_4_;
              }
              auVar2 = vdpps_avx(_local_880,local_980._0_16_,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar103,
                                       ZEXT416((uint)auVar206._0_4_));
              auVar3 = vdpps_avx(local_960._0_16_,local_980._0_16_,0x7f);
              auVar132 = vdpps_avx(_local_880,local_8a0._0_16_,0x7f);
              local_980._0_16_ = vdpps_avx(local_930,local_980._0_16_,0x7f);
              auVar103 = vfmadd213ss_fma(ZEXT416((uint)(auVar103._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_860._0_4_ / fVar95)),auVar4);
              local_b00._0_4_ = auVar103._0_4_;
              auVar104._0_4_ = auVar2._0_4_ * auVar2._0_4_;
              auVar104._4_4_ = auVar2._4_4_ * auVar2._4_4_;
              auVar104._8_4_ = auVar2._8_4_ * auVar2._8_4_;
              auVar104._12_4_ = auVar2._12_4_ * auVar2._12_4_;
              auVar103 = vdpps_avx(_local_880,local_960._0_16_,0x7f);
              auVar142 = vsubps_avx(local_840._0_16_,auVar104);
              auVar4 = vrsqrtss_avx(auVar142,auVar142);
              fVar96 = auVar142._0_4_;
              fVar95 = auVar4._0_4_;
              fVar95 = fVar95 * 1.5 + fVar96 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar4 = vdpps_avx(_local_880,local_930,0x7f);
              local_960._0_16_ = ZEXT416((uint)(auVar3._0_4_ + auVar132._0_4_));
              local_8a0._0_16_ = vfnmadd231ss_fma(auVar103,auVar2,local_960._0_16_);
              auVar103 = vfnmadd231ss_fma(auVar4,auVar2,local_980._0_16_);
              if (fVar96 < 0.0) {
                local_6c0._0_16_ = auVar2;
                local_6e0._0_4_ = fVar95;
                local_700._0_16_ = auVar103;
                auVar266 = ZEXT1664(auVar266._0_16_);
                fVar96 = sqrtf(fVar96);
                fVar95 = (float)local_6e0._0_4_;
                auVar103 = local_700._0_16_;
                auVar2 = local_6c0._0_16_;
              }
              else {
                auVar3 = vsqrtss_avx(auVar142,auVar142);
                fVar96 = auVar3._0_4_;
              }
              auVar258 = ZEXT3264(local_a20);
              auVar261 = ZEXT3264(local_a40);
              auVar281 = ZEXT3264(local_ae0);
              auVar3 = vpermilps_avx(local_6a0._0_16_,0xff);
              auVar4 = vpermilps_avx(local_a60._0_16_,0xff);
              auVar132 = vfmsub213ss_fma(local_8a0._0_16_,ZEXT416((uint)fVar95),auVar4);
              auVar193._0_8_ = local_980._0_8_ ^ 0x8000000080000000;
              auVar193._8_4_ = local_980._8_4_ ^ 0x80000000;
              auVar193._12_4_ = local_980._12_4_ ^ 0x80000000;
              auVar209._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
              auVar209._8_4_ = auVar132._8_4_ ^ 0x80000000;
              auVar209._12_4_ = auVar132._12_4_ ^ 0x80000000;
              auVar103 = ZEXT416((uint)(auVar103._0_4_ * fVar95));
              auVar132 = vfmsub231ss_fma(ZEXT416((uint)(local_980._0_4_ * auVar132._0_4_)),
                                         local_960._0_16_,auVar103);
              auVar103 = vinsertps_avx(auVar103,auVar193,0x10);
              uVar93 = auVar132._0_4_;
              auVar194._4_4_ = uVar93;
              auVar194._0_4_ = uVar93;
              auVar194._8_4_ = uVar93;
              auVar194._12_4_ = uVar93;
              auVar103 = vdivps_avx(auVar103,auVar194);
              auVar142 = ZEXT416((uint)(fVar96 - auVar3._0_4_));
              auVar132 = vinsertps_avx(auVar2,auVar142,0x10);
              auVar166._0_4_ = auVar132._0_4_ * auVar103._0_4_;
              auVar166._4_4_ = auVar132._4_4_ * auVar103._4_4_;
              auVar166._8_4_ = auVar132._8_4_ * auVar103._8_4_;
              auVar166._12_4_ = auVar132._12_4_ * auVar103._12_4_;
              auVar103 = vinsertps_avx(auVar209,local_960._0_16_,0x1c);
              auVar103 = vdivps_avx(auVar103,auVar194);
              auVar3 = vhaddps_avx(auVar166,auVar166);
              auVar195._0_4_ = auVar132._0_4_ * auVar103._0_4_;
              auVar195._4_4_ = auVar132._4_4_ * auVar103._4_4_;
              auVar195._8_4_ = auVar132._8_4_ * auVar103._8_4_;
              auVar195._12_4_ = auVar132._12_4_ * auVar103._12_4_;
              auVar103 = vhaddps_avx(auVar195,auVar195);
              fVar156 = fVar156 - auVar3._0_4_;
              auVar215 = ZEXT464((uint)fVar156);
              fVar125 = fVar125 - auVar103._0_4_;
              auVar103 = vandps_avx(auVar2,local_8e0._0_16_);
              bVar51 = true;
              if ((float)local_b00._0_4_ <= auVar103._0_4_) {
                auVar254 = ZEXT3264(CONCAT824(uStack_988,
                                              CONCAT816(uStack_990,CONCAT88(uStack_998,local_9a0))))
                ;
              }
              else {
                auVar206 = vfmadd231ss_fma(ZEXT416((uint)((float)local_b00._0_4_ + auVar206._0_4_)),
                                           local_720,ZEXT416(0x36000000));
                auVar103 = vandps_avx(auVar142,local_8e0._0_16_);
                auVar254 = ZEXT3264(CONCAT824(uStack_988,
                                              CONCAT816(uStack_990,CONCAT88(uStack_998,local_9a0))))
                ;
                if (auVar103._0_4_ < auVar206._0_4_) {
                  fVar125 = fVar125 + (float)local_820._0_4_;
                  if ((((fVar94 <= fVar125) &&
                       (fVar95 = *(float *)(ray + k * 4 + 0x80), fVar125 <= fVar95)) &&
                      (0.0 <= fVar156)) && (fVar156 <= 1.0)) {
                    auVar103 = vrsqrtss_avx(local_840._0_16_,local_840._0_16_);
                    fVar96 = auVar103._0_4_;
                    pGVar8 = (context->scene->geometries).items[local_9f8].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_BL = true;
                      }
                      else {
                        fVar96 = fVar96 * 1.5 + local_840._0_4_ * -0.5 * fVar96 * fVar96 * fVar96;
                        auVar143._0_4_ = fVar96 * (float)local_880._0_4_;
                        auVar143._4_4_ = fVar96 * (float)local_880._4_4_;
                        auVar143._8_4_ = fVar96 * fStack_878;
                        auVar143._12_4_ = fVar96 * fStack_874;
                        auVar3 = vfmadd213ps_fma(auVar4,auVar143,local_a60._0_16_);
                        auVar103 = vshufps_avx(auVar143,auVar143,0xc9);
                        auVar206 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                        auVar144._0_4_ = auVar143._0_4_ * auVar206._0_4_;
                        auVar144._4_4_ = auVar143._4_4_ * auVar206._4_4_;
                        auVar144._8_4_ = auVar143._8_4_ * auVar206._8_4_;
                        auVar144._12_4_ = auVar143._12_4_ * auVar206._12_4_;
                        auVar2 = vfmsub231ps_fma(auVar144,local_a60._0_16_,auVar103);
                        auVar103 = vshufps_avx(auVar2,auVar2,0xc9);
                        auVar206 = vshufps_avx(auVar3,auVar3,0xc9);
                        auVar2 = vshufps_avx(auVar2,auVar2,0xd2);
                        auVar105._0_4_ = auVar3._0_4_ * auVar2._0_4_;
                        auVar105._4_4_ = auVar3._4_4_ * auVar2._4_4_;
                        auVar105._8_4_ = auVar3._8_4_ * auVar2._8_4_;
                        auVar105._12_4_ = auVar3._12_4_ * auVar2._12_4_;
                        auVar103 = vfmsub231ps_fma(auVar105,auVar103,auVar206);
                        local_660 = (RTCHitN  [16])vshufps_avx(auVar103,auVar103,0x55);
                        auStack_650 = vshufps_avx(auVar103,auVar103,0xaa);
                        local_640 = auVar103._0_4_;
                        local_620 = ZEXT416(0) << 0x20;
                        local_610 = CONCAT44(uStack_67c,local_680);
                        uStack_608 = CONCAT44(uStack_674,uStack_678);
                        local_600._4_4_ = uStack_66c;
                        local_600._0_4_ = local_670;
                        local_600._8_4_ = uStack_668;
                        local_600._12_4_ = uStack_664;
                        vpcmpeqd_avx2(ZEXT1632(local_600),ZEXT1632(local_600));
                        uStack_5ec = context->user->instID[0];
                        local_5f0 = uStack_5ec;
                        uStack_5e8 = uStack_5ec;
                        uStack_5e4 = uStack_5ec;
                        uStack_5e0 = context->user->instPrimID[0];
                        uStack_5dc = uStack_5e0;
                        uStack_5d8 = uStack_5e0;
                        uStack_5d4 = uStack_5e0;
                        *(float *)(ray + k * 4 + 0x80) = fVar125;
                        local_b20 = *local_a00;
                        uStack_b18 = local_a00[1];
                        local_9f0.valid = (int *)&local_b20;
                        local_9f0.geometryUserPtr = pGVar8->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = local_660;
                        local_9f0.N = 4;
                        local_9f0.ray = (RTCRayN *)ray;
                        uStack_63c = local_640;
                        uStack_638 = local_640;
                        uStack_634 = local_640;
                        local_630 = fVar156;
                        fStack_62c = fVar156;
                        fStack_628 = fVar156;
                        fStack_624 = fVar156;
                        if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          (*pGVar8->occlusionFilterN)(&local_9f0);
                          auVar215 = ZEXT1664(ZEXT416((uint)fVar156));
                          auVar281 = ZEXT3264(local_ae0);
                          auVar261 = ZEXT3264(local_a40);
                          auVar258 = ZEXT3264(local_a20);
                          auVar254 = ZEXT3264(CONCAT824(uStack_988,
                                                        CONCAT816(uStack_990,
                                                                  CONCAT88(uStack_998,local_9a0))));
                        }
                        auVar77._8_8_ = uStack_b18;
                        auVar77._0_8_ = local_b20;
                        if (auVar77 == (undefined1  [16])0x0) {
                          auVar103 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar103 = auVar103 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            (*p_Var9)(&local_9f0);
                            auVar215 = ZEXT1664(ZEXT416((uint)fVar156));
                            auVar281 = ZEXT3264(local_ae0);
                            auVar261 = ZEXT3264(local_a40);
                            auVar258 = ZEXT3264(local_a20);
                            auVar254 = ZEXT3264(CONCAT824(uStack_988,
                                                          CONCAT816(uStack_990,
                                                                    CONCAT88(uStack_998,local_9a0)))
                                               );
                          }
                          auVar78._8_8_ = uStack_b18;
                          auVar78._0_8_ = local_b20;
                          auVar206 = vpcmpeqd_avx((undefined1  [16])0x0,auVar78);
                          auVar103 = auVar206 ^ _DAT_01febe20;
                          auVar167._8_4_ = 0xff800000;
                          auVar167._0_8_ = 0xff800000ff800000;
                          auVar167._12_4_ = 0xff800000;
                          auVar206 = vblendvps_avx(auVar167,*(undefined1 (*) [16])
                                                             (local_9f0.ray + 0x80),auVar206);
                          *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar206;
                        }
                        auVar145._8_8_ = 0x100000001;
                        auVar145._0_8_ = 0x100000001;
                        unaff_BL = (auVar145 & auVar103) != (undefined1  [16])0x0;
                        if (!(bool)unaff_BL) {
                          *(float *)(ray + k * 4 + 0x80) = fVar95;
                        }
                      }
                      bVar51 = false;
                      goto LAB_0181b165;
                    }
                  }
                  bVar51 = false;
                  unaff_BL = 0;
                }
              }
LAB_0181b165:
              if (!bVar51) goto LAB_0181b4ad;
              lVar90 = lVar90 + -1;
            } while (lVar90 != 0);
            unaff_BL = 0;
LAB_0181b4ad:
            unaff_BL = unaff_BL & 1;
            uVar92 = CONCAT71(local_740._1_7_,local_740[0] | unaff_BL);
            uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar119._4_4_ = uVar93;
            auVar119._0_4_ = uVar93;
            auVar119._8_4_ = uVar93;
            auVar119._12_4_ = uVar93;
            auVar119._16_4_ = uVar93;
            auVar119._20_4_ = uVar93;
            auVar119._24_4_ = uVar93;
            auVar119._28_4_ = uVar93;
            auVar10 = vcmpps_avx(_local_7a0,auVar119,2);
            auVar117 = vandps_avx(auVar10,local_560);
            local_560 = local_560 & auVar10;
          } while ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_560 >> 0x7f,0) != '\0') ||
                     (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_560 >> 0xbf,0) != '\0') ||
                   (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_560[0x1f] < '\0');
        }
        auVar155._0_4_ = (float)local_8c0._0_4_ + local_3c0._0_4_;
        auVar155._4_4_ = (float)local_8c0._4_4_ + local_3c0._4_4_;
        auVar155._8_4_ = fStack_8b8 + local_3c0._8_4_;
        auVar155._12_4_ = fStack_8b4 + local_3c0._12_4_;
        auVar155._16_4_ = fStack_8b0 + local_3c0._16_4_;
        auVar155._20_4_ = fStack_8ac + local_3c0._20_4_;
        auVar155._24_4_ = fStack_8a8 + local_3c0._24_4_;
        auVar155._28_4_ = fStack_8a4 + local_3c0._28_4_;
        uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar203._4_4_ = uVar93;
        auVar203._0_4_ = uVar93;
        auVar203._8_4_ = uVar93;
        auVar203._12_4_ = uVar93;
        auVar203._16_4_ = uVar93;
        auVar203._20_4_ = uVar93;
        auVar203._24_4_ = uVar93;
        auVar203._28_4_ = uVar93;
        auVar10 = vcmpps_avx(auVar155,auVar203,2);
        auVar117 = vandps_avx(local_4a0,local_480);
        auVar117 = vandps_avx(auVar10,auVar117);
        auVar214._0_4_ = (float)local_8c0._0_4_ + local_380._0_4_;
        auVar214._4_4_ = (float)local_8c0._4_4_ + local_380._4_4_;
        auVar214._8_4_ = fStack_8b8 + local_380._8_4_;
        auVar214._12_4_ = fStack_8b4 + local_380._12_4_;
        auVar214._16_4_ = fStack_8b0 + local_380._16_4_;
        auVar214._20_4_ = fStack_8ac + local_380._20_4_;
        auVar214._24_4_ = fStack_8a8 + local_380._24_4_;
        auVar214._28_4_ = fStack_8a4 + local_380._28_4_;
        auVar108 = vcmpps_avx(auVar214,auVar203,2);
        auVar10 = vandps_avx(_local_7e0,local_7c0);
        auVar10 = vandps_avx(auVar108,auVar10);
        auVar10 = vorps_avx(auVar117,auVar10);
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0x7f,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0xbf,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar87 * 0x60) = auVar10;
          auVar117 = vblendvps_avx(_local_380,local_3c0,auVar117);
          *(undefined1 (*) [32])(auStack_160 + uVar87 * 0x60) = auVar117;
          uVar97 = vmovlps_avx(local_810);
          *(undefined8 *)(afStack_140 + uVar87 * 0x18) = uVar97;
          auStack_138[uVar87 * 0x18] = (int)local_5a0 + 1;
          uVar87 = (ulong)((int)uVar87 + 1);
        }
      }
      auVar215 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    do {
      uVar85 = uStack_568;
      uVar84 = uStack_570;
      uVar83 = uStack_578;
      uVar97 = local_580;
      uVar88 = (uint)uVar87;
      if (uVar88 == 0) {
        if ((uVar92 & 1) != 0) {
          return local_bc1;
        }
        uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar121._4_4_ = uVar93;
        auVar121._0_4_ = uVar93;
        auVar121._8_4_ = uVar93;
        auVar121._12_4_ = uVar93;
        auVar121._16_4_ = uVar93;
        auVar121._20_4_ = uVar93;
        auVar121._24_4_ = uVar93;
        auVar121._28_4_ = uVar93;
        auVar117 = vcmpps_avx(local_320,auVar121,2);
        uVar88 = vmovmskps_avx(auVar117);
        uVar88 = (uint)local_7e8 & uVar88;
        local_bc1 = uVar88 != 0;
        if (!local_bc1) {
          return local_bc1;
        }
        goto LAB_01818eda;
      }
      uVar87 = (ulong)(uVar88 - 1);
      lVar90 = uVar87 * 0x60;
      auVar117 = *(undefined1 (*) [32])(auStack_160 + lVar90);
      auVar115._0_4_ = (float)local_8c0._0_4_ + auVar117._0_4_;
      auVar115._4_4_ = (float)local_8c0._4_4_ + auVar117._4_4_;
      auVar115._8_4_ = fStack_8b8 + auVar117._8_4_;
      auVar115._12_4_ = fStack_8b4 + auVar117._12_4_;
      auVar115._16_4_ = fStack_8b0 + auVar117._16_4_;
      auVar115._20_4_ = fStack_8ac + auVar117._20_4_;
      auVar115._24_4_ = fStack_8a8 + auVar117._24_4_;
      auVar115._28_4_ = fStack_8a4 + auVar117._28_4_;
      uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar200._4_4_ = uVar93;
      auVar200._0_4_ = uVar93;
      auVar200._8_4_ = uVar93;
      auVar200._12_4_ = uVar93;
      auVar200._16_4_ = uVar93;
      auVar200._20_4_ = uVar93;
      auVar200._24_4_ = uVar93;
      auVar200._28_4_ = uVar93;
      auVar10 = vcmpps_avx(auVar115,auVar200,2);
      _local_660 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar90));
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar90) & auVar10;
      bVar73 = (auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar74 = (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar72 = (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar71 = SUB321(auVar10 >> 0x7f,0) == '\0';
      bVar70 = (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar69 = SUB321(auVar10 >> 0xbf,0) == '\0';
      bVar66 = (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar51 = -1 < auVar10[0x1f];
      if (((((((!bVar73 || !bVar74) || !bVar72) || !bVar71) || !bVar70) || !bVar69) || !bVar66) ||
          !bVar51) {
        auVar171._8_4_ = 0x7f800000;
        auVar171._0_8_ = 0x7f8000007f800000;
        auVar171._12_4_ = 0x7f800000;
        auVar171._16_4_ = 0x7f800000;
        auVar171._20_4_ = 0x7f800000;
        auVar171._24_4_ = 0x7f800000;
        auVar171._28_4_ = 0x7f800000;
        auVar117 = vblendvps_avx(auVar171,auVar117,_local_660);
        auVar10 = vshufps_avx(auVar117,auVar117,0xb1);
        auVar10 = vminps_avx(auVar117,auVar10);
        auVar108 = vshufpd_avx(auVar10,auVar10,5);
        auVar10 = vminps_avx(auVar10,auVar108);
        auVar108 = vpermpd_avx2(auVar10,0x4e);
        auVar10 = vminps_avx(auVar10,auVar108);
        auVar10 = vcmpps_avx(auVar117,auVar10,0);
        auVar108 = _local_660 & auVar10;
        auVar117 = _local_660;
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0x7f,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar108 >> 0xbf,0) != '\0') ||
            (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar108[0x1f] < '\0') {
          auVar117 = vandps_avx(auVar10,_local_660);
        }
        fVar125 = afStack_140[uVar87 * 0x18 + 1];
        uVar86 = auStack_138[uVar87 * 0x18];
        uVar91 = vmovmskps_avx(auVar117);
        iVar13 = 0;
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
          iVar13 = iVar13 + 1;
        }
        fVar95 = afStack_140[uVar87 * 0x18];
        auVar116._4_4_ = fVar95;
        auVar116._0_4_ = fVar95;
        auVar116._8_4_ = fVar95;
        auVar116._12_4_ = fVar95;
        auVar116._16_4_ = fVar95;
        auVar116._20_4_ = fVar95;
        auVar116._24_4_ = fVar95;
        auVar116._28_4_ = fVar95;
        *(undefined4 *)(local_660 + (uint)(iVar13 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar90) = _local_660;
        uVar91 = uVar88 - 1;
        if ((((((((_local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_660 >> 0x7f,0) != '\0') ||
              (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_660 >> 0xbf,0) != '\0') ||
            (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_660[0x1f] < '\0') {
          uVar91 = uVar88;
        }
        fVar125 = fVar125 - fVar95;
        auVar147._4_4_ = fVar125;
        auVar147._0_4_ = fVar125;
        auVar147._8_4_ = fVar125;
        auVar147._12_4_ = fVar125;
        auVar147._16_4_ = fVar125;
        auVar147._20_4_ = fVar125;
        auVar147._24_4_ = fVar125;
        auVar147._28_4_ = fVar125;
        auVar103 = vfmadd132ps_fma(auVar147,auVar116,_DAT_02020f20);
        local_3c0 = ZEXT1632(auVar103);
        local_810._8_8_ = 0;
        local_810._0_8_ = *(ulong *)(local_3c0 + (uint)(iVar13 << 2));
        uVar87 = (ulong)uVar91;
        local_5a0 = (ulong)uVar86;
      }
      auVar1._8_8_ = uVar83;
      auVar1._0_8_ = uVar97;
      auVar1._16_8_ = uVar84;
      auVar1._24_8_ = uVar85;
    } while (((((((bVar73 && bVar74) && bVar72) && bVar71) && bVar70) && bVar69) && bVar66) &&
             bVar51);
    auVar242 = auVar258._0_32_;
    auVar260 = auVar261._0_32_;
    auVar271 = auVar281._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }